

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  uint uVar10;
  _func_int *p_Var11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  undefined1 (*pauVar22) [16];
  float *pfVar23;
  byte bVar24;
  ulong uVar25;
  float *pfVar26;
  long lVar27;
  long lVar28;
  float *pfVar29;
  long lVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  float *pfVar38;
  long lVar39;
  float *pfVar40;
  int p_1;
  float fVar47;
  float fVar48;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  v4sf one;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128 _a;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m128 min;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  __m128 max;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar152;
  float fVar153;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  Option opt_flatten;
  uint local_148;
  float *local_e0;
  int *local_d8;
  size_t local_d0;
  int local_c8;
  Allocator *local_c0;
  int local_b8;
  int local_b4;
  undefined8 local_b0;
  int local_a8;
  size_t local_a0;
  undefined1 local_98 [16];
  ulong local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  p_Var11 = this->_vptr_InnerProduct_x86[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0xdc + (long)p_Var11) != 0)) {
    iVar21 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar21;
  }
  local_b8 = bottom_blob->dims;
  if (local_b8 == 2) {
    local_b4 = bottom_blob->w;
    if (local_b4 ==
        *(int *)(&this->field_0xd8 + (long)p_Var11) / *(int *)(&this->field_0xd0 + (long)p_Var11)) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)p_Var11),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      local_80 = (long)bottom_blob->h;
      if (0 < local_80) {
        p_Var11 = this->_vptr_InnerProduct_x86[-3];
        uVar9 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var11);
        lVar12 = *(long *)(&this->field_0x178 + (long)p_Var11);
        uVar10 = bottom_blob->w;
        uVar37 = top_blob->w;
        bVar24 = (uVar37 & 3) == 0 & opt->use_packing_layout;
        iVar21 = bottom_blob->elempack;
        local_88 = (ulong)(uint)((int)uVar37 >> 2);
        lVar39 = 0;
        do {
          if ((iVar21 == 4 & bVar24) == 0) {
LAB_00298b35:
            if ((iVar21 == 1 & bVar24 & 0 < (int)uVar37 >> 2) != 0) {
              pauVar22 = (undefined1 (*) [16])
                         (top_blob->w * lVar39 * top_blob->elemsize + (long)top_blob->data);
              uVar25 = 0;
              do {
                if (lVar12 == 0) {
                  auVar43 = ZEXT816(0);
                }
                else {
                  auVar43 = *(undefined1 (*) [16])(lVar12 + uVar25 * 0x10);
                }
                if (0 < (int)uVar10) {
                  pfVar29 = (float *)((long)(this->weight_data_tm).w * uVar25 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  lVar28 = 0;
                  auVar145 = auVar43;
                  do {
                    auVar124._0_4_ =
                         *(float *)((long)bottom_blob->data +
                                   lVar28 * 4 +
                                   bottom_blob->elemsize * lVar39 * (long)bottom_blob->w);
                    auVar43._0_4_ = auVar145._0_4_ + *pfVar29 * auVar124._0_4_;
                    auVar43._4_4_ = auVar145._4_4_ + pfVar29[1] * auVar124._0_4_;
                    auVar43._8_4_ = auVar145._8_4_ + pfVar29[2] * auVar124._0_4_;
                    auVar43._12_4_ = auVar145._12_4_ + pfVar29[3] * auVar124._0_4_;
                    pfVar29 = pfVar29 + 4;
                    lVar28 = lVar28 + 1;
                    auVar145 = auVar43;
                  } while (uVar10 != (uint)lVar28);
                }
                auVar124._0_4_ = auVar43._0_4_;
                fVar47 = auVar43._4_4_;
                fVar48 = auVar43._8_4_;
                fVar49 = auVar43._12_4_;
                fVar155 = (float)DAT_00556310;
                fVar159 = DAT_00556310._4_4_;
                fVar160 = DAT_00556310._8_4_;
                fVar161 = DAT_00556310._12_4_;
                switch(uVar9) {
                case 1:
                  auVar43 = maxps(auVar43,_DAT_00553060);
                  break;
                case 2:
                  auVar146 = maxps(auVar43,ZEXT816(0));
                  auVar145 = minps(auVar43,ZEXT816(0));
                  auVar124._0_4_ = **(float **)(&this->field_0xe8 + (long)p_Var11);
                  auVar43._4_4_ = auVar124._0_4_ * auVar145._4_4_ + auVar146._4_4_;
                  auVar43._0_4_ = auVar124._0_4_ * auVar145._0_4_ + auVar146._0_4_;
                  auVar43._8_4_ = auVar124._0_4_ * auVar145._8_4_ + auVar146._8_4_;
                  auVar43._12_4_ = auVar124._0_4_ * auVar145._12_4_ + auVar146._12_4_;
                  break;
                case 3:
                  uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var11);
                  uVar6 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var11))[1];
                  auVar55._4_4_ = uVar7;
                  auVar55._0_4_ = uVar7;
                  auVar55._8_4_ = uVar7;
                  auVar55._12_4_ = uVar7;
                  auVar73._4_4_ = uVar6;
                  auVar73._0_4_ = uVar6;
                  auVar73._8_4_ = uVar6;
                  auVar73._12_4_ = uVar6;
                  auVar145 = maxps(auVar43,auVar55);
                  auVar43 = minps(auVar145,auVar73);
                  break;
                case 4:
                  auVar44._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
                  auVar44._8_4_ = -fVar48;
                  auVar44._12_4_ = -fVar49;
                  auVar145 = minps(auVar44,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar47 = auVar145._0_4_ * 1.442695 + fVar155;
                  fVar49 = auVar145._4_4_ * 1.442695 + fVar159;
                  fVar152 = auVar145._8_4_ * 1.442695 + fVar160;
                  fVar154 = auVar145._12_4_ * 1.442695 + fVar161;
                  auVar124._0_4_ = (float)(int)fVar47;
                  fVar48 = (float)(int)fVar49;
                  fVar140 = (float)(int)fVar152;
                  fVar153 = (float)(int)fVar154;
                  fVar162 = (float)DAT_00556320;
                  fVar163 = DAT_00556320._4_4_;
                  fVar164 = DAT_00556320._8_4_;
                  fVar165 = DAT_00556320._12_4_;
                  auVar124._0_4_ =
                       auVar124._0_4_ - (float)(-(uint)(fVar47 < auVar124._0_4_) & (uint)fVar162);
                  fVar48 = fVar48 - (float)(-(uint)(fVar49 < fVar48) & (uint)fVar163);
                  fVar140 = fVar140 - (float)(-(uint)(fVar152 < fVar140) & (uint)fVar164);
                  fVar153 = fVar153 - (float)(-(uint)(fVar154 < fVar153) & (uint)fVar165);
                  fVar47 = auVar124._0_4_ * -0.6931472 + auVar145._0_4_;
                  fVar49 = fVar48 * -0.6931472 + auVar145._4_4_;
                  fVar152 = fVar140 * -0.6931472 + auVar145._8_4_;
                  fVar154 = fVar153 * -0.6931472 + auVar145._12_4_;
                  auVar56._0_4_ =
                       fVar47 + fVar162 +
                       (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47
                         + 0.041665796) * fVar47 + 0.16666666) * fVar47 + fVar155) * fVar47 * fVar47
                  ;
                  auVar56._4_4_ =
                       fVar49 + fVar163 +
                       (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49
                         + 0.041665796) * fVar49 + 0.16666666) * fVar49 + fVar159) * fVar49 * fVar49
                  ;
                  auVar56._8_4_ =
                       fVar152 + fVar164 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar160) *
                       fVar152 * fVar152;
                  auVar56._12_4_ =
                       fVar154 + fVar165 +
                       (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                          fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + fVar161) *
                       fVar154 * fVar154;
                  auVar74._0_4_ =
                       (float)((int)auVar124._0_4_ * 0x800000 + (int)fVar162) * auVar56._0_4_ +
                       fVar162;
                  auVar74._4_4_ =
                       (float)((int)fVar48 * 0x800000 + (int)fVar163) * auVar56._4_4_ + fVar163;
                  auVar74._8_4_ =
                       (float)((int)fVar140 * 0x800000 + (int)fVar164) * auVar56._8_4_ + fVar164;
                  auVar74._12_4_ =
                       (float)((int)fVar153 * 0x800000 + (int)fVar165) * auVar56._12_4_ + fVar165;
                  auVar145 = rcpps(auVar56,auVar74);
                  auVar124._0_4_ = auVar145._0_4_;
                  fVar47 = auVar145._4_4_;
                  fVar48 = auVar145._8_4_;
                  fVar49 = auVar145._12_4_;
                  auVar43._0_4_ =
                       (fVar162 - auVar74._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                  auVar43._4_4_ = (fVar163 - auVar74._4_4_ * fVar47) * fVar47 + fVar47;
                  auVar43._8_4_ = (fVar164 - auVar74._8_4_ * fVar48) * fVar48 + fVar48;
                  auVar43._12_4_ = (fVar165 - auVar74._12_4_ * fVar49) * fVar49 + fVar49;
                  break;
                case 5:
                  auVar145 = minps(auVar43,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar140 = auVar145._0_4_ * 1.442695 + fVar155;
                  fVar152 = auVar145._4_4_ * 1.442695 + fVar159;
                  fVar153 = auVar145._8_4_ * 1.442695 + fVar160;
                  fVar154 = auVar145._12_4_ * 1.442695 + fVar161;
                  fVar162 = (float)(int)fVar140;
                  fVar163 = (float)(int)fVar152;
                  fVar164 = (float)(int)fVar153;
                  fVar165 = (float)(int)fVar154;
                  fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & 0x3f800000);
                  fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & 0x3f800000);
                  fVar164 = fVar164 - (float)(-(uint)(fVar153 < fVar164) & 0x3f800000);
                  fVar165 = fVar165 - (float)(-(uint)(fVar154 < fVar165) & 0x3f800000);
                  fVar140 = auVar145._0_4_ - fVar162 * 0.6931472;
                  fVar152 = auVar145._4_4_ - fVar163 * 0.6931472;
                  fVar153 = auVar145._8_4_ - fVar164 * 0.6931472;
                  fVar154 = auVar145._12_4_ - fVar165 * 0.6931472;
                  auVar70._0_4_ =
                       (float)((int)fVar162 * 0x800000 + 0x3f800000) *
                       (fVar140 + 1.0 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar155) *
                       fVar140 * fVar140) + 1.0;
                  auVar70._4_4_ =
                       (float)((int)fVar163 * 0x800000 + 0x3f800000) *
                       (fVar152 + 1.0 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar159) *
                       fVar152 * fVar152) + 1.0;
                  auVar70._8_4_ =
                       (float)((int)fVar164 * 0x800000 + 0x3f800000) *
                       (fVar153 + 1.0 +
                       (((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                          fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153 + fVar160) *
                       fVar153 * fVar153) + 1.0;
                  auVar70._12_4_ =
                       (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                       (fVar154 + 1.0 +
                       (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                          fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + fVar161) *
                       fVar154 * fVar154) + 1.0;
                  auVar145 = maxps(auVar70,_DAT_00556390);
                  auVar71._0_8_ = auVar145._0_8_ & 0x807fffff807fffff;
                  auVar71._8_4_ = auVar145._8_4_ & 0x807fffff;
                  auVar71._12_4_ = auVar145._12_4_ & 0x807fffff;
                  auVar71 = auVar71 | _DAT_00556310;
                  fVar140 = auVar71._0_4_;
                  fVar153 = auVar71._4_4_;
                  fVar162 = auVar71._8_4_;
                  fVar164 = auVar71._12_4_;
                  fVar152 = fVar140 + (float)DAT_005563d0 +
                            (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
                  fVar154 = fVar153 + DAT_005563d0._4_4_ +
                            (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar153);
                  fVar163 = fVar162 + DAT_005563d0._8_4_ +
                            (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
                  fVar165 = fVar164 + DAT_005563d0._12_4_ +
                            (float)(-(uint)(fVar164 < 0.70710677) & (uint)fVar164);
                  auVar72._0_4_ =
                       ~-(uint)(auVar70._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar152 +
                              (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984)
                                     * fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                                  -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) *
                                fVar152 + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
                  auVar72._4_4_ =
                       ~-(uint)(auVar70._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar153 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar154 +
                              (((((((((fVar154 * 0.070376836 + -0.1151461) * fVar154 + 0.116769984)
                                     * fVar154 + -0.12420141) * fVar154 + 0.14249323) * fVar154 +
                                  -0.16668057) * fVar154 + 0.20000714) * fVar154 + -0.24999994) *
                                fVar154 + 0.3333333) * fVar154 + -0.5) * fVar154 * fVar154) * -2.0);
                  auVar72._8_4_ =
                       ~-(uint)(auVar70._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar162 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar163 +
                              (((((((((fVar163 * 0.070376836 + -0.1151461) * fVar163 + 0.116769984)
                                     * fVar163 + -0.12420141) * fVar163 + 0.14249323) * fVar163 +
                                  -0.16668057) * fVar163 + 0.20000714) * fVar163 + -0.24999994) *
                                fVar163 + 0.3333333) * fVar163 + -0.5) * fVar163 * fVar163) * -2.0);
                  auVar72._12_4_ =
                       ~-(uint)(auVar70._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar164 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar165 +
                              (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984)
                                     * fVar165 + -0.12420141) * fVar165 + 0.14249323) * fVar165 +
                                  -0.16668057) * fVar165 + 0.20000714) * fVar165 + -0.24999994) *
                                fVar165 + 0.3333333) * fVar165 + -0.5) * fVar165 * fVar165) * -2.0);
                  auVar53._0_8_ =
                       CONCAT44(-(uint)(auVar70._4_4_ <= 0.0),-(uint)(auVar70._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar53._8_4_ = -(uint)(auVar70._8_4_ <= 0.0) & 0x7fffffff;
                  auVar53._12_4_ = -(uint)(auVar70._12_4_ <= 0.0) & 0x7fffffff;
                  auVar145 = minps(auVar53 | auVar72,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar140 = auVar145._0_4_ * 1.442695 + fVar155;
                  fVar152 = auVar145._4_4_ * 1.442695 + fVar159;
                  fVar153 = auVar145._8_4_ * 1.442695 + fVar160;
                  fVar154 = auVar145._12_4_ * 1.442695 + fVar161;
                  fVar162 = (float)(int)fVar140;
                  fVar163 = (float)(int)fVar152;
                  fVar164 = (float)(int)fVar153;
                  fVar165 = (float)(int)fVar154;
                  fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & 0x3f800000);
                  fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & 0x3f800000);
                  fVar164 = fVar164 - (float)(-(uint)(fVar153 < fVar164) & 0x3f800000);
                  fVar165 = fVar165 - (float)(-(uint)(fVar154 < fVar165) & 0x3f800000);
                  fVar140 = auVar145._0_4_ - fVar162 * 0.6931472;
                  fVar152 = auVar145._4_4_ - fVar163 * 0.6931472;
                  fVar153 = auVar145._8_4_ - fVar164 * 0.6931472;
                  fVar154 = auVar145._12_4_ - fVar165 * 0.6931472;
                  auVar54._0_4_ =
                       fVar140 + 1.0 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar155) *
                       fVar140 * fVar140;
                  auVar54._4_4_ =
                       fVar152 + 1.0 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar159) *
                       fVar152 * fVar152;
                  auVar54._8_4_ =
                       fVar153 + 1.0 +
                       (((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                          fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153 + fVar160) *
                       fVar153 * fVar153;
                  auVar54._12_4_ =
                       fVar154 + 1.0 +
                       (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                          fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + fVar161) *
                       fVar154 * fVar154;
                  auVar98._0_4_ =
                       (float)((int)fVar162 * 0x800000 + 0x3f800000) * auVar54._0_4_ + 1.0;
                  auVar98._4_4_ =
                       (float)((int)fVar163 * 0x800000 + 0x3f800000) * auVar54._4_4_ + 1.0;
                  auVar98._8_4_ =
                       (float)((int)fVar164 * 0x800000 + 0x3f800000) * auVar54._8_4_ + 1.0;
                  auVar98._12_4_ =
                       (float)((int)fVar165 * 0x800000 + 0x3f800000) * auVar54._12_4_ + 1.0;
                  auVar145 = rcpps(auVar54,auVar98);
                  fVar155 = auVar145._0_4_;
                  fVar159 = auVar145._4_4_;
                  fVar160 = auVar145._8_4_;
                  fVar161 = auVar145._12_4_;
                  auVar43._0_4_ =
                       auVar124._0_4_ *
                       (fVar155 + fVar155 + (float)DAT_005563d0 +
                       (2.0 - auVar98._0_4_ * (fVar155 + fVar155)) * fVar155);
                  auVar43._4_4_ =
                       fVar47 * (fVar159 + fVar159 + DAT_005563d0._4_4_ +
                                (2.0 - auVar98._4_4_ * (fVar159 + fVar159)) * fVar159);
                  auVar43._8_4_ =
                       fVar48 * (fVar160 + fVar160 + DAT_005563d0._8_4_ +
                                (2.0 - auVar98._8_4_ * (fVar160 + fVar160)) * fVar160);
                  auVar43._12_4_ =
                       fVar49 * (fVar161 + fVar161 + DAT_005563d0._12_4_ +
                                (2.0 - auVar98._12_4_ * (fVar161 + fVar161)) * fVar161);
                  break;
                case 6:
                  fVar155 = **(float **)(&this->field_0xe8 + (long)p_Var11);
                  fVar159 = (*(float **)(&this->field_0xe8 + (long)p_Var11))[1];
                  auVar57._0_4_ = fVar155 * auVar124._0_4_ + fVar159;
                  auVar57._4_4_ = fVar155 * fVar47 + fVar159;
                  auVar57._8_4_ = fVar155 * fVar48 + fVar159;
                  auVar57._12_4_ = fVar155 * fVar49 + fVar159;
                  auVar145 = maxps(auVar57,_DAT_00553060);
                  auVar145 = minps(auVar145,_DAT_00556320);
                  auVar43._0_4_ = auVar124._0_4_ * auVar145._0_4_;
                  auVar43._4_4_ = fVar47 * auVar145._4_4_;
                  auVar43._8_4_ = fVar48 * auVar145._8_4_;
                  auVar43._12_4_ = fVar49 * auVar145._12_4_;
                }
                *pauVar22 = auVar43;
                pauVar22 = pauVar22 + 1;
                uVar25 = uVar25 + 1;
              } while (uVar25 != local_88);
            }
          }
          else if (0 < (int)local_88) {
            pauVar22 = (undefined1 (*) [16])
                       (top_blob->w * lVar39 * top_blob->elemsize + (long)top_blob->data);
            uVar25 = 0;
            do {
              if (lVar12 == 0) {
                auVar145 = ZEXT816(0);
              }
              else {
                auVar145 = *(undefined1 (*) [16])(lVar12 + uVar25 * 0x10);
              }
              auVar146 = auVar145;
              auVar147 = auVar145;
              auVar108 = auVar145;
              if (0 < (int)uVar10) {
                lVar28 = bottom_blob->elemsize * lVar39 * (long)bottom_blob->w;
                pvVar13 = bottom_blob->data;
                lVar33 = 0;
                auVar121 = auVar145;
                auVar120 = auVar145;
                auVar67 = auVar145;
                auVar95 = auVar145;
                uVar34 = uVar10;
                do {
                  auVar124._0_4_ = *(float *)((long)pvVar13 + lVar33 + lVar28);
                  fVar47 = *(float *)((long)pvVar13 + lVar33 + lVar28 + 4);
                  fVar48 = *(float *)((long)pvVar13 + lVar33 + lVar28 + 8);
                  fVar49 = *(float *)((long)pvVar13 + lVar33 + lVar28 + 0xc);
                  pfVar29 = (float *)((long)(this->weight_data_tm).data +
                                     lVar33 + (this->weight_data_tm).elemsize * uVar25 *
                                              (long)(this->weight_data_tm).w);
                  fVar155 = *pfVar29;
                  fVar159 = pfVar29[1];
                  fVar160 = pfVar29[2];
                  fVar161 = pfVar29[3];
                  auVar145._0_4_ = auVar121._0_4_ + auVar124._0_4_ * fVar155;
                  auVar145._4_4_ = auVar121._4_4_ + auVar124._0_4_ * fVar159;
                  auVar145._8_4_ = auVar121._8_4_ + auVar124._0_4_ * fVar160;
                  auVar145._12_4_ = auVar121._12_4_ + auVar124._0_4_ * fVar161;
                  auVar108._0_4_ = auVar95._0_4_ + fVar47 * fVar155;
                  auVar108._4_4_ = auVar95._4_4_ + fVar47 * fVar159;
                  auVar108._8_4_ = auVar95._8_4_ + fVar47 * fVar160;
                  auVar108._12_4_ = auVar95._12_4_ + fVar47 * fVar161;
                  auVar146._0_4_ = auVar120._0_4_ + fVar48 * fVar155;
                  auVar146._4_4_ = auVar120._4_4_ + fVar48 * fVar159;
                  auVar146._8_4_ = auVar120._8_4_ + fVar48 * fVar160;
                  auVar146._12_4_ = auVar120._12_4_ + fVar48 * fVar161;
                  auVar147._0_4_ = auVar67._0_4_ + fVar49 * fVar155;
                  auVar147._4_4_ = auVar67._4_4_ + fVar49 * fVar159;
                  auVar147._8_4_ = auVar67._8_4_ + fVar49 * fVar160;
                  auVar147._12_4_ = auVar67._12_4_ + fVar49 * fVar161;
                  lVar33 = lVar33 + 0x10;
                  uVar34 = uVar34 - 1;
                  auVar121 = auVar145;
                  auVar120 = auVar146;
                  auVar67 = auVar147;
                  auVar95 = auVar108;
                } while (uVar34 != 0);
              }
              auVar124._0_4_ = auVar145._0_4_;
              fVar47 = auVar145._4_4_;
              fVar48 = auVar145._8_4_;
              fVar49 = auVar145._12_4_;
              fVar162 = auVar108._0_4_;
              fVar163 = auVar108._4_4_;
              fVar164 = auVar108._8_4_;
              fVar165 = auVar108._12_4_;
              fVar155 = auVar146._0_4_;
              fVar159 = auVar146._4_4_;
              fVar160 = auVar146._8_4_;
              fVar161 = auVar146._12_4_;
              fVar140 = auVar147._0_4_;
              fVar152 = auVar147._4_4_;
              fVar153 = auVar147._8_4_;
              fVar154 = auVar147._12_4_;
              switch(uVar9) {
              case 1:
                auVar121 = ZEXT816(0);
                auVar145 = maxps(auVar145,auVar121);
                auVar108 = maxps(auVar108,auVar121);
                auVar146 = maxps(auVar146,auVar121);
                auVar147 = maxps(auVar147,auVar121);
                break;
              case 2:
                auVar67 = ZEXT816(0);
                auVar120 = maxps(auVar145,auVar67);
                auVar121 = minps(auVar145,auVar67);
                auVar124._0_4_ = **(float **)(&this->field_0xe8 + (long)p_Var11);
                auVar145._0_4_ = auVar121._0_4_ * auVar124._0_4_ + auVar120._0_4_;
                auVar145._4_4_ = auVar121._4_4_ * auVar124._0_4_ + auVar120._4_4_;
                auVar145._8_4_ = auVar121._8_4_ * auVar124._0_4_ + auVar120._8_4_;
                auVar145._12_4_ = auVar121._12_4_ * auVar124._0_4_ + auVar120._12_4_;
                auVar120 = maxps(auVar108,auVar67);
                auVar121 = minps(auVar108,auVar67);
                auVar108._0_4_ = auVar121._0_4_ * auVar124._0_4_ + auVar120._0_4_;
                auVar108._4_4_ = auVar121._4_4_ * auVar124._0_4_ + auVar120._4_4_;
                auVar108._8_4_ = auVar121._8_4_ * auVar124._0_4_ + auVar120._8_4_;
                auVar108._12_4_ = auVar121._12_4_ * auVar124._0_4_ + auVar120._12_4_;
                auVar120 = maxps(auVar146,auVar67);
                auVar121 = minps(auVar146,auVar67);
                auVar146._0_4_ = auVar121._0_4_ * auVar124._0_4_ + auVar120._0_4_;
                auVar146._4_4_ = auVar121._4_4_ * auVar124._0_4_ + auVar120._4_4_;
                auVar146._8_4_ = auVar121._8_4_ * auVar124._0_4_ + auVar120._8_4_;
                auVar146._12_4_ = auVar121._12_4_ * auVar124._0_4_ + auVar120._12_4_;
                auVar120 = maxps(auVar147,auVar67);
                auVar121 = minps(auVar147,auVar67);
                auVar147._0_4_ = auVar121._0_4_ * auVar124._0_4_ + auVar120._0_4_;
                auVar147._4_4_ = auVar121._4_4_ * auVar124._0_4_ + auVar120._4_4_;
                auVar147._8_4_ = auVar121._8_4_ * auVar124._0_4_ + auVar120._8_4_;
                auVar147._12_4_ = auVar121._12_4_ * auVar124._0_4_ + auVar120._12_4_;
                break;
              case 3:
                uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var11);
                uVar6 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var11))[1];
                auVar115._4_4_ = uVar7;
                auVar115._0_4_ = uVar7;
                auVar115._8_4_ = uVar7;
                auVar115._12_4_ = uVar7;
                auVar133._4_4_ = uVar6;
                auVar133._0_4_ = uVar6;
                auVar133._8_4_ = uVar6;
                auVar133._12_4_ = uVar6;
                auVar145 = maxps(auVar145,auVar115);
                auVar145 = minps(auVar145,auVar133);
                auVar108 = maxps(auVar108,auVar115);
                auVar108 = minps(auVar108,auVar133);
                auVar146 = maxps(auVar146,auVar115);
                auVar146 = minps(auVar146,auVar133);
                auVar147 = maxps(auVar147,auVar115);
                auVar147 = minps(auVar147,auVar133);
                break;
              case 4:
                auVar41._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar41._8_4_ = -fVar48;
                auVar41._12_4_ = -fVar49;
                auVar145 = minps(auVar41,_DAT_005562e0);
                auVar145 = maxps(auVar145,_DAT_005562f0);
                auVar124._0_4_ = auVar145._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar145._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar145._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar145._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar140 = (float)(int)fVar48;
                fVar152 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar140 = fVar140 - (float)(-(uint)(fVar48 < fVar140) & 0x3f800000);
                fVar152 = fVar152 - (float)(-(uint)(fVar49 < fVar152) & 0x3f800000);
                auVar124._0_4_ = auVar145._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar145._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar145._8_4_ - fVar140 * 0.6931472;
                fVar49 = auVar145._12_4_ - fVar152 * 0.6931472;
                auVar116._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                auVar116._4_4_ = fVar47 * fVar47;
                auVar116._8_4_ = fVar48 * fVar48;
                auVar116._12_4_ = fVar49 * fVar49;
                auVar134._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar116._0_4_) + 1.0;
                auVar134._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * auVar116._4_4_) + 1.0;
                auVar134._8_4_ =
                     (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * auVar116._8_4_) + 1.0;
                auVar134._12_4_ =
                     (float)((int)fVar152 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * auVar116._12_4_) + 1.0;
                auVar145 = rcpps(auVar116,auVar134);
                auVar124._0_4_ = auVar145._0_4_;
                fVar47 = auVar145._4_4_;
                fVar48 = auVar145._8_4_;
                fVar49 = auVar145._12_4_;
                auVar145._0_4_ =
                     (1.0 - auVar134._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                auVar145._4_4_ = (1.0 - auVar134._4_4_ * fVar47) * fVar47 + fVar47;
                auVar145._8_4_ = (1.0 - auVar134._8_4_ * fVar48) * fVar48 + fVar48;
                auVar145._12_4_ = (1.0 - auVar134._12_4_ * fVar49) * fVar49 + fVar49;
                auVar96._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
                auVar96._8_4_ = -fVar164;
                auVar96._12_4_ = -fVar165;
                auVar108 = minps(auVar96,_DAT_005562e0);
                auVar108 = maxps(auVar108,_DAT_005562f0);
                auVar124._0_4_ = auVar108._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar108._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar108._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar108._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar140 = (float)(int)fVar48;
                fVar152 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar140 = fVar140 - (float)(-(uint)(fVar48 < fVar140) & 0x3f800000);
                fVar152 = fVar152 - (float)(-(uint)(fVar49 < fVar152) & 0x3f800000);
                auVar124._0_4_ = auVar108._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar108._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar108._8_4_ - fVar140 * 0.6931472;
                fVar49 = auVar108._12_4_ - fVar152 * 0.6931472;
                auVar117._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                auVar117._4_4_ = fVar47 * fVar47;
                auVar117._8_4_ = fVar48 * fVar48;
                auVar117._12_4_ = fVar49 * fVar49;
                fVar162 = (float)DAT_00556370;
                fVar163 = DAT_00556370._4_4_;
                fVar164 = DAT_00556370._8_4_;
                fVar165 = DAT_00556370._12_4_;
                auVar135._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + fVar162) * auVar124._0_4_ + 0.16666666) *
                      auVar124._0_4_ + 0.5) * auVar117._0_4_) + 1.0;
                auVar135._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar163) * fVar47 + 0.16666666) * fVar47 + 0.5) * auVar117._4_4_) + 1.0;
                auVar135._8_4_ =
                     (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       fVar164) * fVar48 + 0.16666666) * fVar48 + 0.5) * auVar117._8_4_) + 1.0;
                auVar135._12_4_ =
                     (float)((int)fVar152 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       fVar165) * fVar49 + 0.16666666) * fVar49 + 0.5) * auVar117._12_4_) + 1.0;
                auVar108 = rcpps(auVar117,auVar135);
                auVar124._0_4_ = auVar108._0_4_;
                fVar47 = auVar108._4_4_;
                fVar48 = auVar108._8_4_;
                fVar49 = auVar108._12_4_;
                auVar108._0_4_ =
                     (1.0 - auVar135._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                auVar108._4_4_ = (1.0 - auVar135._4_4_ * fVar47) * fVar47 + fVar47;
                auVar108._8_4_ = (1.0 - auVar135._8_4_ * fVar48) * fVar48 + fVar48;
                auVar108._12_4_ = (1.0 - auVar135._12_4_ * fVar49) * fVar49 + fVar49;
                auVar50._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
                auVar50._8_4_ = -fVar160;
                auVar50._12_4_ = -fVar161;
                auVar146 = minps(auVar50,_DAT_005562e0);
                auVar146 = maxps(auVar146,_DAT_005562f0);
                auVar124._0_4_ = auVar146._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar146._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar146._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar146._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar160 = (float)(int)fVar48;
                fVar161 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar160 = fVar160 - (float)(-(uint)(fVar48 < fVar160) & 0x3f800000);
                fVar161 = fVar161 - (float)(-(uint)(fVar49 < fVar161) & 0x3f800000);
                auVar124._0_4_ = auVar146._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar146._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar146._8_4_ - fVar160 * 0.6931472;
                fVar49 = auVar146._12_4_ - fVar161 * 0.6931472;
                auVar118._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                auVar118._4_4_ = fVar47 * fVar47;
                auVar118._8_4_ = fVar48 * fVar48;
                auVar118._12_4_ = fVar49 * fVar49;
                auVar136._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + fVar162) * auVar124._0_4_ + 0.16666666) *
                      auVar124._0_4_ + 0.5) * auVar118._0_4_) + 1.0;
                auVar136._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar163) * fVar47 + 0.16666666) * fVar47 + 0.5) * auVar118._4_4_) + 1.0;
                auVar136._8_4_ =
                     (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       fVar164) * fVar48 + 0.16666666) * fVar48 + 0.5) * auVar118._8_4_) + 1.0;
                auVar136._12_4_ =
                     (float)((int)fVar161 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       fVar165) * fVar49 + 0.16666666) * fVar49 + 0.5) * auVar118._12_4_) + 1.0;
                auVar146 = rcpps(auVar118,auVar136);
                auVar124._0_4_ = auVar146._0_4_;
                fVar47 = auVar146._4_4_;
                fVar48 = auVar146._8_4_;
                fVar49 = auVar146._12_4_;
                auVar146._0_4_ =
                     (1.0 - auVar136._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                auVar146._4_4_ = (1.0 - auVar136._4_4_ * fVar47) * fVar47 + fVar47;
                auVar146._8_4_ = (1.0 - auVar136._8_4_ * fVar48) * fVar48 + fVar48;
                auVar146._12_4_ = (1.0 - auVar136._12_4_ * fVar49) * fVar49 + fVar49;
                auVar68._0_8_ = auVar147._0_8_ ^ 0x8000000080000000;
                auVar68._8_4_ = -fVar153;
                auVar68._12_4_ = -fVar154;
                auVar147 = minps(auVar68,_DAT_005562e0);
                auVar147 = maxps(auVar147,_DAT_005562f0);
                auVar124._0_4_ = auVar147._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar147._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar147._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar147._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar160 = (float)(int)fVar48;
                fVar161 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar160 = fVar160 - (float)(-(uint)(fVar48 < fVar160) & 0x3f800000);
                fVar161 = fVar161 - (float)(-(uint)(fVar49 < fVar161) & 0x3f800000);
                auVar124._0_4_ = auVar147._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar147._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar147._8_4_ - fVar160 * 0.6931472;
                fVar49 = auVar147._12_4_ - fVar161 * 0.6931472;
                auVar137._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                auVar137._4_4_ = fVar47 * fVar47;
                auVar137._8_4_ = fVar48 * fVar48;
                auVar137._12_4_ = fVar49 * fVar49;
                auVar119._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + fVar162) * auVar124._0_4_ + 0.16666666) *
                      auVar124._0_4_ + 0.5) * auVar137._0_4_) + 1.0;
                auVar119._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar163) * fVar47 + 0.16666666) * fVar47 + 0.5) * auVar137._4_4_) + 1.0;
                auVar119._8_4_ =
                     (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       fVar164) * fVar48 + 0.16666666) * fVar48 + 0.5) * auVar137._8_4_) + 1.0;
                auVar119._12_4_ =
                     (float)((int)fVar161 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       fVar165) * fVar49 + 0.16666666) * fVar49 + 0.5) * auVar137._12_4_) + 1.0;
                auVar147 = rcpps(auVar137,auVar119);
                auVar124._0_4_ = auVar147._0_4_;
                fVar47 = auVar147._4_4_;
                fVar48 = auVar147._8_4_;
                fVar49 = auVar147._12_4_;
                auVar147._0_4_ =
                     (1.0 - auVar119._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                auVar147._4_4_ = (1.0 - auVar119._4_4_ * fVar47) * fVar47 + fVar47;
                auVar147._8_4_ = (1.0 - auVar119._8_4_ * fVar48) * fVar48 + fVar48;
                auVar147._12_4_ = (1.0 - auVar119._12_4_ * fVar49) * fVar49 + fVar49;
                break;
              case 5:
                auVar145 = minps(auVar145,_DAT_005562e0);
                auVar145 = maxps(auVar145,_DAT_005562f0);
                fVar166 = auVar145._0_4_ * 1.442695 + 0.5;
                fVar168 = auVar145._4_4_ * 1.442695 + 0.5;
                fVar170 = auVar145._8_4_ * 1.442695 + 0.5;
                fVar172 = auVar145._12_4_ * 1.442695 + 0.5;
                fVar167 = (float)(int)fVar166;
                fVar169 = (float)(int)fVar168;
                fVar171 = (float)(int)fVar170;
                fVar173 = (float)(int)fVar172;
                fVar167 = fVar167 - (float)(-(uint)(fVar166 < fVar167) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar168 < fVar169) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar170 < fVar171) & 0x3f800000);
                fVar173 = fVar173 - (float)(-(uint)(fVar172 < fVar173) & 0x3f800000);
                fVar166 = auVar145._0_4_ - fVar167 * 0.6931472;
                fVar168 = auVar145._4_4_ - fVar169 * 0.6931472;
                fVar170 = auVar145._8_4_ - fVar171 * 0.6931472;
                fVar172 = auVar145._12_4_ - fVar173 * 0.6931472;
                auVar125._0_4_ =
                     (float)((int)fVar167 * 0x800000 + 0x3f800000) *
                     (fVar166 + 1.0 +
                     (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166
                       + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) * fVar166 * fVar166)
                     + 1.0;
                auVar125._4_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar168 + 1.0 +
                     (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168
                       + 0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168)
                     + 1.0;
                auVar125._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) *
                     (fVar170 + 1.0 +
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170)
                     + 1.0;
                auVar125._12_4_ =
                     (float)((int)fVar173 * 0x800000 + 0x3f800000) *
                     (fVar172 + 1.0 +
                     (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172
                       + 0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172)
                     + 1.0;
                auVar145 = maxps(auVar125,_DAT_00556390);
                fVar166 = (float)(auVar145._0_4_ & 0x807fffff | 0x3f000000);
                fVar170 = (float)(auVar145._4_4_ & 0x807fffff | 0x3f000000);
                fVar167 = (float)(auVar145._8_4_ & 0x807fffff | 0x3f000000);
                fVar171 = (float)(auVar145._12_4_ & 0x807fffff | 0x3f000000);
                fVar168 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
                fVar172 = fVar170 + -1.0 + (float)(-(uint)(fVar170 < 0.70710677) & (uint)fVar170);
                fVar169 = fVar167 + -1.0 + (float)(-(uint)(fVar167 < 0.70710677) & (uint)fVar167);
                fVar173 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                auVar126._0_8_ =
                     CONCAT44(-(uint)(auVar125._4_4_ <= 0.0),-(uint)(auVar125._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar126._8_4_ = -(uint)(auVar125._8_4_ <= 0.0) & 0x7fffffff;
                auVar126._12_4_ = -(uint)(auVar125._12_4_ <= 0.0) & 0x7fffffff;
                auVar106._0_4_ =
                     ~-(uint)(auVar125._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar145._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar166 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar106._4_4_ =
                     ~-(uint)(auVar125._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar145._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar170 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar172 +
                            (((((((((fVar172 * 0.070376836 + -0.1151461) * fVar172 + 0.116769984) *
                                   fVar172 + -0.12420141) * fVar172 + 0.14249323) * fVar172 +
                                -0.16668057) * fVar172 + 0.20000714) * fVar172 + -0.24999994) *
                              fVar172 + 0.3333333) * fVar172 + -0.5) * fVar172 * fVar172) * -2.0);
                auVar106._8_4_ =
                     ~-(uint)(auVar125._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar145._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar167 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar169 +
                            (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) *
                                   fVar169 + -0.12420141) * fVar169 + 0.14249323) * fVar169 +
                                -0.16668057) * fVar169 + 0.20000714) * fVar169 + -0.24999994) *
                              fVar169 + 0.3333333) * fVar169 + -0.5) * fVar169 * fVar169) * -2.0);
                auVar106._12_4_ =
                     ~-(uint)(auVar125._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar145._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar173 +
                            (((((((((fVar173 * 0.070376836 + -0.1151461) * fVar173 + 0.116769984) *
                                   fVar173 + -0.12420141) * fVar173 + 0.14249323) * fVar173 +
                                -0.16668057) * fVar173 + 0.20000714) * fVar173 + -0.24999994) *
                              fVar173 + 0.3333333) * fVar173 + -0.5) * fVar173 * fVar173) * -2.0);
                auVar145 = minps(auVar106 | auVar126,_DAT_005562e0);
                auVar145 = maxps(auVar145,_DAT_005562f0);
                fVar166 = auVar145._0_4_ * 1.442695 + 0.5;
                fVar168 = auVar145._4_4_ * 1.442695 + 0.5;
                fVar170 = auVar145._8_4_ * 1.442695 + 0.5;
                fVar172 = auVar145._12_4_ * 1.442695 + 0.5;
                fVar167 = (float)(int)fVar166;
                fVar169 = (float)(int)fVar168;
                fVar171 = (float)(int)fVar170;
                fVar173 = (float)(int)fVar172;
                fVar167 = fVar167 - (float)(-(uint)(fVar166 < fVar167) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar168 < fVar169) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar170 < fVar171) & 0x3f800000);
                fVar173 = fVar173 - (float)(-(uint)(fVar172 < fVar173) & 0x3f800000);
                fVar166 = auVar145._0_4_ - fVar167 * 0.6931472;
                fVar168 = auVar145._4_4_ - fVar169 * 0.6931472;
                fVar170 = auVar145._8_4_ - fVar171 * 0.6931472;
                fVar172 = auVar145._12_4_ - fVar173 * 0.6931472;
                auVar107._0_4_ =
                     fVar166 + 1.0 +
                     (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166
                       + 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5) * fVar166 * fVar166;
                auVar107._4_4_ =
                     fVar168 + 1.0 +
                     (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168
                       + 0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168;
                auVar107._8_4_ =
                     fVar170 + 1.0 +
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170;
                auVar107._12_4_ =
                     fVar172 + 1.0 +
                     (((((fVar172 * 0.00019875691 + 0.0013981999) * fVar172 + 0.008333452) * fVar172
                       + 0.041665796) * fVar172 + 0.16666666) * fVar172 + 0.5) * fVar172 * fVar172;
                auVar141._0_4_ =
                     (float)((int)fVar167 * 0x800000 + 0x3f800000) * auVar107._0_4_ + 1.0;
                auVar141._4_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar107._4_4_ + 1.0;
                auVar141._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar107._8_4_ + 1.0;
                auVar141._12_4_ =
                     (float)((int)fVar173 * 0x800000 + 0x3f800000) * auVar107._12_4_ + 1.0;
                auVar145 = rcpps(auVar107,auVar141);
                fVar166 = auVar145._0_4_;
                fVar168 = auVar145._4_4_;
                fVar170 = auVar145._8_4_;
                fVar172 = auVar145._12_4_;
                auVar145._0_4_ =
                     auVar124._0_4_ *
                     (fVar166 + fVar166 + -1.0 +
                     (2.0 - auVar141._0_4_ * (fVar166 + fVar166)) * fVar166);
                auVar145._4_4_ =
                     fVar47 * (fVar168 + fVar168 + -1.0 +
                              (2.0 - auVar141._4_4_ * (fVar168 + fVar168)) * fVar168);
                auVar145._8_4_ =
                     fVar48 * (fVar170 + fVar170 + -1.0 +
                              (2.0 - auVar141._8_4_ * (fVar170 + fVar170)) * fVar170);
                auVar145._12_4_ =
                     fVar49 * (fVar172 + fVar172 + -1.0 +
                              (2.0 - auVar141._12_4_ * (fVar172 + fVar172)) * fVar172);
                auVar108 = minps(auVar108,_DAT_005562e0);
                auVar108 = maxps(auVar108,_DAT_005562f0);
                auVar124._0_4_ = auVar108._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar108._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar108._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar108._12_4_ * 1.442695 + 0.5;
                fVar166 = (float)(int)auVar124._0_4_;
                fVar168 = (float)(int)fVar47;
                fVar170 = (float)(int)fVar48;
                fVar172 = (float)(int)fVar49;
                fVar166 = fVar166 - (float)(-(uint)(auVar124._0_4_ < fVar166) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar47 < fVar168) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar48 < fVar170) & 0x3f800000);
                fVar172 = fVar172 - (float)(-(uint)(fVar49 < fVar172) & 0x3f800000);
                auVar124._0_4_ = auVar108._0_4_ - fVar166 * 0.6931472;
                fVar47 = auVar108._4_4_ - fVar168 * 0.6931472;
                fVar48 = auVar108._8_4_ - fVar170 * 0.6931472;
                fVar49 = auVar108._12_4_ - fVar172 * 0.6931472;
                auVar127._0_4_ =
                     (float)((int)fVar166 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_) + 1.0;
                auVar127._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar127._8_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48) + 1.0;
                auVar127._12_4_ =
                     (float)((int)fVar172 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49) + 1.0;
                auVar108 = maxps(auVar127,_DAT_00556390);
                auVar124._0_4_ = (float)(auVar108._0_4_ & 0x807fffff | 0x3f000000);
                fVar48 = (float)(auVar108._4_4_ & 0x807fffff | 0x3f000000);
                fVar166 = (float)(auVar108._8_4_ & 0x807fffff | 0x3f000000);
                fVar170 = (float)(auVar108._12_4_ & 0x807fffff | 0x3f000000);
                fVar47 = auVar124._0_4_ + -1.0 +
                         (float)(-(uint)(auVar124._0_4_ < 0.70710677) & (uint)auVar124._0_4_);
                fVar49 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
                fVar168 = fVar166 + -1.0 + (float)(-(uint)(fVar166 < 0.70710677) & (uint)fVar166);
                fVar172 = fVar170 + -1.0 + (float)(-(uint)(fVar170 < 0.70710677) & (uint)fVar170);
                auVar128._0_8_ =
                     CONCAT44(-(uint)(auVar127._4_4_ <= 0.0),-(uint)(auVar127._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar128._8_4_ = -(uint)(auVar127._8_4_ <= 0.0) & 0x7fffffff;
                auVar128._12_4_ = -(uint)(auVar127._12_4_ <= 0.0) & 0x7fffffff;
                auVar109._0_4_ =
                     ~-(uint)(auVar127._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar108._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(auVar124._0_4_ < 0.70710677) & 0x3f800000)) * 0.6931472
                             + fVar47 +
                            (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) *
                                   fVar47 + -0.12420141) * fVar47 + 0.14249323) * fVar47 +
                                -0.16668057) * fVar47 + 0.20000714) * fVar47 + -0.24999994) * fVar47
                             + 0.3333333) * fVar47 + -0.5) * fVar47 * fVar47) * -2.0);
                auVar109._4_4_ =
                     ~-(uint)(auVar127._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar108._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar49 + (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 +
                                             0.116769984) * fVar49 + -0.12420141) * fVar49 +
                                           0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                                         ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 +
                                      -0.5) * fVar49 * fVar49) * -2.0);
                auVar109._8_4_ =
                     ~-(uint)(auVar127._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar108._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar166 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar109._12_4_ =
                     ~-(uint)(auVar127._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar108._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar170 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar172 +
                            (((((((((fVar172 * 0.070376836 + -0.1151461) * fVar172 + 0.116769984) *
                                   fVar172 + -0.12420141) * fVar172 + 0.14249323) * fVar172 +
                                -0.16668057) * fVar172 + 0.20000714) * fVar172 + -0.24999994) *
                              fVar172 + 0.3333333) * fVar172 + -0.5) * fVar172 * fVar172) * -2.0);
                auVar108 = minps(auVar109 | auVar128,_DAT_005562e0);
                auVar108 = maxps(auVar108,_DAT_005562f0);
                auVar124._0_4_ = auVar108._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar108._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar108._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar108._12_4_ * 1.442695 + 0.5;
                fVar166 = (float)(int)auVar124._0_4_;
                fVar168 = (float)(int)fVar47;
                fVar170 = (float)(int)fVar48;
                fVar172 = (float)(int)fVar49;
                fVar166 = fVar166 - (float)(-(uint)(auVar124._0_4_ < fVar166) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar47 < fVar168) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar48 < fVar170) & 0x3f800000);
                fVar172 = fVar172 - (float)(-(uint)(fVar49 < fVar172) & 0x3f800000);
                auVar124._0_4_ = auVar108._0_4_ - fVar166 * 0.6931472;
                fVar47 = auVar108._4_4_ - fVar168 * 0.6931472;
                fVar48 = auVar108._8_4_ - fVar170 * 0.6931472;
                fVar49 = auVar108._12_4_ - fVar172 * 0.6931472;
                auVar110._0_4_ =
                     auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_;
                auVar110._4_4_ =
                     fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47;
                auVar110._8_4_ =
                     fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48;
                auVar110._12_4_ =
                     fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49;
                auVar142._0_4_ =
                     (float)((int)fVar166 * 0x800000 + 0x3f800000) * auVar110._0_4_ + 1.0;
                auVar142._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar110._4_4_ + 1.0;
                auVar142._8_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar110._8_4_ + 1.0;
                auVar142._12_4_ =
                     (float)((int)fVar172 * 0x800000 + 0x3f800000) * auVar110._12_4_ + 1.0;
                auVar108 = rcpps(auVar110,auVar142);
                auVar124._0_4_ = auVar108._0_4_;
                fVar47 = auVar108._4_4_;
                fVar48 = auVar108._8_4_;
                fVar49 = auVar108._12_4_;
                auVar108._0_4_ =
                     fVar162 * (auVar124._0_4_ + auVar124._0_4_ + -1.0 +
                               (2.0 - auVar142._0_4_ * (auVar124._0_4_ + auVar124._0_4_)) *
                               auVar124._0_4_);
                auVar108._4_4_ =
                     fVar163 * (fVar47 + fVar47 + -1.0 +
                               (2.0 - auVar142._4_4_ * (fVar47 + fVar47)) * fVar47);
                auVar108._8_4_ =
                     fVar164 * (fVar48 + fVar48 + -1.0 +
                               (2.0 - auVar142._8_4_ * (fVar48 + fVar48)) * fVar48);
                auVar108._12_4_ =
                     fVar165 * (fVar49 + fVar49 + -1.0 +
                               (2.0 - auVar142._12_4_ * (fVar49 + fVar49)) * fVar49);
                auVar146 = minps(auVar146,_DAT_005562e0);
                auVar146 = maxps(auVar146,_DAT_005562f0);
                auVar124._0_4_ = auVar146._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar146._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar146._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar146._12_4_ * 1.442695 + 0.5;
                fVar162 = (float)(int)auVar124._0_4_;
                fVar163 = (float)(int)fVar47;
                fVar164 = (float)(int)fVar48;
                fVar165 = (float)(int)fVar49;
                fVar162 = fVar162 - (float)(-(uint)(auVar124._0_4_ < fVar162) & 0x3f800000);
                fVar163 = fVar163 - (float)(-(uint)(fVar47 < fVar163) & 0x3f800000);
                fVar164 = fVar164 - (float)(-(uint)(fVar48 < fVar164) & 0x3f800000);
                fVar165 = fVar165 - (float)(-(uint)(fVar49 < fVar165) & 0x3f800000);
                auVar124._0_4_ = auVar146._0_4_ - fVar162 * 0.6931472;
                fVar47 = auVar146._4_4_ - fVar163 * 0.6931472;
                fVar48 = auVar146._8_4_ - fVar164 * 0.6931472;
                fVar49 = auVar146._12_4_ - fVar165 * 0.6931472;
                auVar129._0_4_ =
                     (float)((int)fVar162 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_) + 1.0;
                auVar129._4_4_ =
                     (float)((int)fVar163 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar129._8_4_ =
                     (float)((int)fVar164 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48) + 1.0;
                auVar129._12_4_ =
                     (float)((int)fVar165 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49) + 1.0;
                auVar146 = maxps(auVar129,_DAT_00556390);
                auVar124._0_4_ = (float)(auVar146._0_4_ & 0x807fffff | 0x3f000000);
                fVar48 = (float)(auVar146._4_4_ & 0x807fffff | 0x3f000000);
                fVar162 = (float)(auVar146._8_4_ & 0x807fffff | 0x3f000000);
                fVar164 = (float)(auVar146._12_4_ & 0x807fffff | 0x3f000000);
                fVar47 = auVar124._0_4_ + -1.0 +
                         (float)(-(uint)(auVar124._0_4_ < 0.70710677) & (uint)auVar124._0_4_);
                fVar49 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
                fVar163 = fVar162 + -1.0 + (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
                fVar165 = fVar164 + -1.0 + (float)(-(uint)(fVar164 < 0.70710677) & (uint)fVar164);
                auVar130._0_8_ =
                     CONCAT44(-(uint)(auVar129._4_4_ <= 0.0),-(uint)(auVar129._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar130._8_4_ = -(uint)(auVar129._8_4_ <= 0.0) & 0x7fffffff;
                auVar130._12_4_ = -(uint)(auVar129._12_4_ <= 0.0) & 0x7fffffff;
                auVar111._0_4_ =
                     ~-(uint)(auVar129._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar146._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(auVar124._0_4_ < 0.70710677) & 0x3f800000)) * 0.6931472
                             + fVar47 +
                            (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) *
                                   fVar47 + -0.12420141) * fVar47 + 0.14249323) * fVar47 +
                                -0.16668057) * fVar47 + 0.20000714) * fVar47 + -0.24999994) * fVar47
                             + 0.3333333) * fVar47 + -0.5) * fVar47 * fVar47) * -2.0);
                auVar111._4_4_ =
                     ~-(uint)(auVar129._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar146._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar49 + (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 +
                                             0.116769984) * fVar49 + -0.12420141) * fVar49 +
                                           0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                                         ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 +
                                      -0.5) * fVar49 * fVar49) * -2.0);
                auVar111._8_4_ =
                     ~-(uint)(auVar129._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar146._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar162 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar163 +
                            (((((((((fVar163 * 0.070376836 + -0.1151461) * fVar163 + 0.116769984) *
                                   fVar163 + -0.12420141) * fVar163 + 0.14249323) * fVar163 +
                                -0.16668057) * fVar163 + 0.20000714) * fVar163 + -0.24999994) *
                              fVar163 + 0.3333333) * fVar163 + -0.5) * fVar163 * fVar163) * -2.0);
                auVar111._12_4_ =
                     ~-(uint)(auVar129._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar146._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar164 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar165 +
                            (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) *
                                   fVar165 + -0.12420141) * fVar165 + 0.14249323) * fVar165 +
                                -0.16668057) * fVar165 + 0.20000714) * fVar165 + -0.24999994) *
                              fVar165 + 0.3333333) * fVar165 + -0.5) * fVar165 * fVar165) * -2.0);
                auVar146 = minps(auVar111 | auVar130,_DAT_005562e0);
                auVar146 = maxps(auVar146,_DAT_005562f0);
                auVar124._0_4_ = auVar146._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar146._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar146._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar146._12_4_ * 1.442695 + 0.5;
                fVar162 = (float)(int)auVar124._0_4_;
                fVar163 = (float)(int)fVar47;
                fVar164 = (float)(int)fVar48;
                fVar165 = (float)(int)fVar49;
                fVar162 = fVar162 - (float)(-(uint)(auVar124._0_4_ < fVar162) & 0x3f800000);
                fVar163 = fVar163 - (float)(-(uint)(fVar47 < fVar163) & 0x3f800000);
                fVar164 = fVar164 - (float)(-(uint)(fVar48 < fVar164) & 0x3f800000);
                fVar165 = fVar165 - (float)(-(uint)(fVar49 < fVar165) & 0x3f800000);
                auVar124._0_4_ = auVar146._0_4_ - fVar162 * 0.6931472;
                fVar47 = auVar146._4_4_ - fVar163 * 0.6931472;
                fVar48 = auVar146._8_4_ - fVar164 * 0.6931472;
                fVar49 = auVar146._12_4_ - fVar165 * 0.6931472;
                auVar112._0_4_ =
                     auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_;
                auVar112._4_4_ =
                     fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47;
                auVar112._8_4_ =
                     fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48;
                auVar112._12_4_ =
                     fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49;
                auVar143._0_4_ =
                     (float)((int)fVar162 * 0x800000 + 0x3f800000) * auVar112._0_4_ + 1.0;
                auVar143._4_4_ =
                     (float)((int)fVar163 * 0x800000 + 0x3f800000) * auVar112._4_4_ + 1.0;
                auVar143._8_4_ =
                     (float)((int)fVar164 * 0x800000 + 0x3f800000) * auVar112._8_4_ + 1.0;
                auVar143._12_4_ =
                     (float)((int)fVar165 * 0x800000 + 0x3f800000) * auVar112._12_4_ + 1.0;
                auVar146 = rcpps(auVar112,auVar143);
                auVar124._0_4_ = auVar146._0_4_;
                fVar47 = auVar146._4_4_;
                fVar48 = auVar146._8_4_;
                fVar49 = auVar146._12_4_;
                auVar146._0_4_ =
                     fVar155 * (auVar124._0_4_ + auVar124._0_4_ + -1.0 +
                               (2.0 - auVar143._0_4_ * (auVar124._0_4_ + auVar124._0_4_)) *
                               auVar124._0_4_);
                auVar146._4_4_ =
                     fVar159 * (fVar47 + fVar47 + -1.0 +
                               (2.0 - auVar143._4_4_ * (fVar47 + fVar47)) * fVar47);
                auVar146._8_4_ =
                     fVar160 * (fVar48 + fVar48 + -1.0 +
                               (2.0 - auVar143._8_4_ * (fVar48 + fVar48)) * fVar48);
                auVar146._12_4_ =
                     fVar161 * (fVar49 + fVar49 + -1.0 +
                               (2.0 - auVar143._12_4_ * (fVar49 + fVar49)) * fVar49);
                auVar147 = minps(auVar147,_DAT_005562e0);
                auVar147 = maxps(auVar147,_DAT_005562f0);
                auVar124._0_4_ = auVar147._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar147._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar147._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar147._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar160 = (float)(int)fVar48;
                fVar161 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar160 = fVar160 - (float)(-(uint)(fVar48 < fVar160) & 0x3f800000);
                fVar161 = fVar161 - (float)(-(uint)(fVar49 < fVar161) & 0x3f800000);
                auVar124._0_4_ = auVar147._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar147._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar147._8_4_ - fVar160 * 0.6931472;
                fVar49 = auVar147._12_4_ - fVar161 * 0.6931472;
                auVar131._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_) + 1.0;
                auVar131._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar131._8_4_ =
                     (float)((int)fVar160 * 0x800000 + 0x3f800000) *
                     (fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48) + 1.0;
                auVar131._12_4_ =
                     (float)((int)fVar161 * 0x800000 + 0x3f800000) *
                     (fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49) + 1.0;
                auVar147 = maxps(auVar131,_DAT_00556390);
                auVar124._0_4_ = (float)(auVar147._0_4_ & 0x807fffff | 0x3f000000);
                fVar48 = (float)(auVar147._4_4_ & 0x807fffff | 0x3f000000);
                fVar155 = (float)(auVar147._8_4_ & 0x807fffff | 0x3f000000);
                fVar160 = (float)(auVar147._12_4_ & 0x807fffff | 0x3f000000);
                fVar47 = auVar124._0_4_ + -1.0 +
                         (float)(-(uint)(auVar124._0_4_ < 0.70710677) & (uint)auVar124._0_4_);
                fVar49 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
                fVar159 = fVar155 + -1.0 + (float)(-(uint)(fVar155 < 0.70710677) & (uint)fVar155);
                fVar161 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
                auVar132._0_8_ =
                     CONCAT44(-(uint)(auVar131._4_4_ <= 0.0),-(uint)(auVar131._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar132._8_4_ = -(uint)(auVar131._8_4_ <= 0.0) & 0x7fffffff;
                auVar132._12_4_ = -(uint)(auVar131._12_4_ <= 0.0) & 0x7fffffff;
                auVar113._0_4_ =
                     ~-(uint)(auVar131._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar147._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(auVar124._0_4_ < 0.70710677) & 0x3f800000)) * 0.6931472
                             + fVar47 +
                            (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) *
                                   fVar47 + -0.12420141) * fVar47 + 0.14249323) * fVar47 +
                                -0.16668057) * fVar47 + 0.20000714) * fVar47 + -0.24999994) * fVar47
                             + 0.3333333) * fVar47 + -0.5) * fVar47 * fVar47) * -2.0);
                auVar113._4_4_ =
                     ~-(uint)(auVar131._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar147._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar49 + (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 +
                                             0.116769984) * fVar49 + -0.12420141) * fVar49 +
                                           0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                                         ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 +
                                      -0.5) * fVar49 * fVar49) * -2.0);
                auVar113._8_4_ =
                     ~-(uint)(auVar131._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar147._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar155 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar159 +
                            (((((((((fVar159 * 0.070376836 + -0.1151461) * fVar159 + 0.116769984) *
                                   fVar159 + -0.12420141) * fVar159 + 0.14249323) * fVar159 +
                                -0.16668057) * fVar159 + 0.20000714) * fVar159 + -0.24999994) *
                              fVar159 + 0.3333333) * fVar159 + -0.5) * fVar159 * fVar159) * -2.0);
                auVar113._12_4_ =
                     ~-(uint)(auVar131._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar147._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar160 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar161 +
                            (((((((((fVar161 * 0.070376836 + -0.1151461) * fVar161 + 0.116769984) *
                                   fVar161 + -0.12420141) * fVar161 + 0.14249323) * fVar161 +
                                -0.16668057) * fVar161 + 0.20000714) * fVar161 + -0.24999994) *
                              fVar161 + 0.3333333) * fVar161 + -0.5) * fVar161 * fVar161) * -2.0);
                auVar147 = minps(auVar113 | auVar132,_DAT_005562e0);
                auVar147 = maxps(auVar147,_DAT_005562f0);
                auVar124._0_4_ = auVar147._0_4_ * 1.442695 + 0.5;
                fVar47 = auVar147._4_4_ * 1.442695 + 0.5;
                fVar48 = auVar147._8_4_ * 1.442695 + 0.5;
                fVar49 = auVar147._12_4_ * 1.442695 + 0.5;
                fVar155 = (float)(int)auVar124._0_4_;
                fVar159 = (float)(int)fVar47;
                fVar160 = (float)(int)fVar48;
                fVar161 = (float)(int)fVar49;
                fVar155 = fVar155 - (float)(-(uint)(auVar124._0_4_ < fVar155) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar47 < fVar159) & 0x3f800000);
                fVar160 = fVar160 - (float)(-(uint)(fVar48 < fVar160) & 0x3f800000);
                fVar161 = fVar161 - (float)(-(uint)(fVar49 < fVar161) & 0x3f800000);
                auVar124._0_4_ = auVar147._0_4_ - fVar155 * 0.6931472;
                fVar47 = auVar147._4_4_ - fVar159 * 0.6931472;
                fVar48 = auVar147._8_4_ - fVar160 * 0.6931472;
                fVar49 = auVar147._12_4_ - fVar161 * 0.6931472;
                auVar114._0_4_ =
                     auVar124._0_4_ + 1.0 +
                     (((((auVar124._0_4_ * 0.00019875691 + 0.0013981999) * auVar124._0_4_ +
                        0.008333452) * auVar124._0_4_ + 0.041665796) * auVar124._0_4_ + 0.16666666)
                      * auVar124._0_4_ + 0.5) * auVar124._0_4_ * auVar124._0_4_;
                auVar114._4_4_ =
                     fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47;
                auVar114._8_4_ =
                     fVar48 + 1.0 +
                     (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
                       0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5) * fVar48 * fVar48;
                auVar114._12_4_ =
                     fVar49 + 1.0 +
                     (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
                       0.041665796) * fVar49 + 0.16666666) * fVar49 + 0.5) * fVar49 * fVar49;
                auVar144._0_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) * auVar114._0_4_ + 1.0;
                auVar144._4_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar114._4_4_ + 1.0;
                auVar144._8_4_ =
                     (float)((int)fVar160 * 0x800000 + 0x3f800000) * auVar114._8_4_ + 1.0;
                auVar144._12_4_ =
                     (float)((int)fVar161 * 0x800000 + 0x3f800000) * auVar114._12_4_ + 1.0;
                auVar147 = rcpps(auVar114,auVar144);
                auVar124._0_4_ = auVar147._0_4_;
                fVar47 = auVar147._4_4_;
                fVar48 = auVar147._8_4_;
                fVar49 = auVar147._12_4_;
                auVar147._0_4_ =
                     fVar140 * (auVar124._0_4_ + auVar124._0_4_ + -1.0 +
                               (2.0 - auVar144._0_4_ * (auVar124._0_4_ + auVar124._0_4_)) *
                               auVar124._0_4_);
                auVar147._4_4_ =
                     fVar152 * (fVar47 + fVar47 + -1.0 +
                               (2.0 - auVar144._4_4_ * (fVar47 + fVar47)) * fVar47);
                auVar147._8_4_ =
                     fVar153 * (fVar48 + fVar48 + -1.0 +
                               (2.0 - auVar144._8_4_ * (fVar48 + fVar48)) * fVar48);
                auVar147._12_4_ =
                     fVar154 * (fVar49 + fVar49 + -1.0 +
                               (2.0 - auVar144._12_4_ * (fVar49 + fVar49)) * fVar49);
                break;
              case 6:
                fVar166 = **(float **)(&this->field_0xe8 + (long)p_Var11);
                fVar168 = (*(float **)(&this->field_0xe8 + (long)p_Var11))[1];
                auVar120._0_4_ = fVar166 * auVar124._0_4_ + fVar168;
                auVar120._4_4_ = fVar166 * fVar47 + fVar168;
                auVar120._8_4_ = fVar166 * fVar48 + fVar168;
                auVar120._12_4_ = fVar166 * fVar49 + fVar168;
                auVar145 = maxps(auVar120,ZEXT816(0));
                auVar146 = minps(auVar145,_DAT_00556320);
                auVar145._0_4_ = auVar124._0_4_ * auVar146._0_4_;
                auVar145._4_4_ = fVar47 * auVar146._4_4_;
                auVar145._8_4_ = fVar48 * auVar146._8_4_;
                auVar145._12_4_ = fVar49 * auVar146._12_4_;
                auVar67._0_4_ = fVar166 * fVar162 + fVar168;
                auVar67._4_4_ = fVar166 * fVar163 + fVar168;
                auVar67._8_4_ = fVar166 * fVar164 + fVar168;
                auVar67._12_4_ = fVar166 * fVar165 + fVar168;
                auVar146 = maxps(auVar67,ZEXT816(0));
                auVar146 = minps(auVar146,_DAT_00556320);
                auVar108._0_4_ = fVar162 * auVar146._0_4_;
                auVar108._4_4_ = fVar163 * auVar146._4_4_;
                auVar108._8_4_ = fVar164 * auVar146._8_4_;
                auVar108._12_4_ = fVar165 * auVar146._12_4_;
                auVar95._0_4_ = fVar166 * fVar155 + fVar168;
                auVar95._4_4_ = fVar166 * fVar159 + fVar168;
                auVar95._8_4_ = fVar166 * fVar160 + fVar168;
                auVar95._12_4_ = fVar166 * fVar161 + fVar168;
                auVar146 = maxps(auVar95,ZEXT816(0));
                auVar147 = minps(auVar146,_DAT_00556320);
                auVar146._0_4_ = fVar155 * auVar147._0_4_;
                auVar146._4_4_ = fVar159 * auVar147._4_4_;
                auVar146._8_4_ = fVar160 * auVar147._8_4_;
                auVar146._12_4_ = fVar161 * auVar147._12_4_;
                auVar121._0_4_ = fVar166 * fVar140 + fVar168;
                auVar121._4_4_ = fVar166 * fVar152 + fVar168;
                auVar121._8_4_ = fVar166 * fVar153 + fVar168;
                auVar121._12_4_ = fVar166 * fVar154 + fVar168;
                auVar147 = maxps(auVar121,ZEXT816(0));
                auVar121 = minps(auVar147,_DAT_00556320);
                auVar147._0_4_ = fVar140 * auVar121._0_4_;
                auVar147._4_4_ = fVar152 * auVar121._4_4_;
                auVar147._8_4_ = fVar153 * auVar121._8_4_;
                auVar147._12_4_ = fVar154 * auVar121._12_4_;
              }
              auVar122._0_8_ = auVar145._0_8_;
              auVar122._8_4_ = auVar145._4_4_;
              auVar122._12_4_ = auVar108._4_4_;
              auVar69._4_4_ = auVar108._0_4_;
              auVar69._0_4_ = auVar145._0_4_;
              auVar138._0_8_ = auVar146._0_8_;
              auVar138._8_4_ = auVar146._4_4_;
              auVar138._12_4_ = auVar147._4_4_;
              auVar139._8_8_ = auVar138._8_8_;
              auVar69._12_4_ = auVar147._0_4_;
              auVar69._8_4_ = auVar146._0_4_;
              auVar42._0_8_ = CONCAT44(auVar108._8_4_,auVar145._8_4_);
              auVar42._8_4_ = auVar145._12_4_;
              auVar42._12_4_ = auVar108._12_4_;
              auVar51._0_8_ = CONCAT44(auVar147._8_4_,auVar146._8_4_);
              auVar51._8_4_ = auVar146._12_4_;
              auVar51._12_4_ = auVar147._12_4_;
              auVar139._0_8_ = auVar122._8_8_;
              auVar97._8_8_ = auVar51._0_8_;
              auVar97._0_8_ = auVar42._0_8_;
              auVar52._8_8_ = auVar51._8_8_;
              auVar52._0_8_ = auVar42._8_8_;
              *pauVar22 = auVar69;
              pauVar22[1] = auVar139;
              pauVar22[2] = auVar97;
              pauVar22[3] = auVar52;
              pauVar22 = pauVar22 + 4;
              uVar25 = uVar25 + 1;
            } while (uVar25 != local_88);
            goto LAB_00298b35;
          }
          if (iVar21 == 4 && bVar24 == 0) {
            if (0 < (int)uVar37) {
              pauVar22 = (undefined1 (*) [16])
                         (top_blob->w * lVar39 * top_blob->elemsize + (long)top_blob->data);
              uVar25 = 0;
              do {
                auVar75 = ZEXT816(0);
                auVar58 = ZEXT816(0);
                if (lVar12 != 0) {
                  uVar7 = *(undefined4 *)(lVar12 + uVar25 * 4);
                  auVar58._4_4_ = (float)uVar7;
                  auVar58._0_4_ = (float)uVar7;
                  auVar58._8_4_ = (float)uVar7;
                  auVar58._12_4_ = (float)uVar7;
                }
                pfVar29 = (float *)(uVar25 * (long)(int)uVar10 * 4 +
                                   (long)(this->weight_data_tm).data);
                pauVar31 = (undefined1 (*) [16])
                           (bottom_blob->w * lVar39 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
                uVar34 = 0;
                if ((int)uVar10 < 4) {
                  auVar124._0_4_ = 0.0;
                  fVar47 = 0.0;
                  fVar48 = 0.0;
                  fVar49 = 0.0;
                  auVar99 = ZEXT816(0);
                }
                else {
                  iVar32 = 3;
                  auVar124._0_4_ = 0.0;
                  fVar47 = 0.0;
                  fVar48 = 0.0;
                  fVar49 = 0.0;
                  auVar145 = auVar58;
                  auVar146 = auVar75;
                  auVar147 = ZEXT816(0);
                  do {
                    auVar108 = *pauVar31;
                    auVar121 = pauVar31[1];
                    auVar120 = pauVar31[2];
                    auVar67 = pauVar31[3];
                    fVar155 = *pfVar29;
                    fVar159 = pfVar29[1];
                    fVar160 = pfVar29[2];
                    fVar161 = pfVar29[3];
                    auVar58._0_4_ = auVar145._0_4_ + fVar155 * auVar108._0_4_;
                    auVar58._4_4_ = auVar145._4_4_ + fVar155 * auVar108._4_4_;
                    auVar58._8_4_ = auVar145._8_4_ + fVar155 * auVar108._8_4_;
                    auVar58._12_4_ = auVar145._12_4_ + fVar155 * auVar108._12_4_;
                    auVar99._0_4_ = auVar147._0_4_ + fVar159 * auVar121._0_4_;
                    auVar99._4_4_ = auVar147._4_4_ + fVar159 * auVar121._4_4_;
                    auVar99._8_4_ = auVar147._8_4_ + fVar159 * auVar121._8_4_;
                    auVar99._12_4_ = auVar147._12_4_ + fVar159 * auVar121._12_4_;
                    auVar124._0_4_ = auVar124._0_4_ + fVar160 * auVar120._0_4_;
                    fVar47 = fVar47 + fVar160 * auVar120._4_4_;
                    fVar48 = fVar48 + fVar160 * auVar120._8_4_;
                    fVar49 = fVar49 + fVar160 * auVar120._12_4_;
                    auVar75._0_4_ = auVar146._0_4_ + fVar161 * auVar67._0_4_;
                    auVar75._4_4_ = auVar146._4_4_ + fVar161 * auVar67._4_4_;
                    auVar75._8_4_ = auVar146._8_4_ + fVar161 * auVar67._8_4_;
                    auVar75._12_4_ = auVar146._12_4_ + fVar161 * auVar67._12_4_;
                    pauVar31 = pauVar31 + 4;
                    pfVar29 = pfVar29 + 4;
                    iVar32 = iVar32 + 4;
                    auVar145 = auVar58;
                    auVar146 = auVar75;
                    auVar147 = auVar99;
                  } while (iVar32 < (int)uVar10);
                  uVar34 = uVar10 & 0xfffffffc;
                }
                if ((int)uVar34 < (int)uVar10) {
                  lVar28 = 0;
                  auVar145 = auVar58;
                  do {
                    auVar146 = *pauVar31;
                    fVar155 = pfVar29[lVar28];
                    auVar58._0_4_ = auVar145._0_4_ + fVar155 * auVar146._0_4_;
                    auVar58._4_4_ = auVar145._4_4_ + fVar155 * auVar146._4_4_;
                    auVar58._8_4_ = auVar145._8_4_ + fVar155 * auVar146._8_4_;
                    auVar58._12_4_ = auVar145._12_4_ + fVar155 * auVar146._12_4_;
                    pauVar31 = pauVar31 + 1;
                    lVar28 = lVar28 + 1;
                    auVar145 = auVar58;
                  } while (uVar10 - uVar34 != (int)lVar28);
                }
                auVar124._0_4_ = auVar124._0_4_ + auVar75._0_4_ + auVar99._0_4_ + auVar58._0_4_;
                fVar47 = fVar47 + auVar75._4_4_ + auVar99._4_4_ + auVar58._4_4_;
                auVar45._0_8_ = CONCAT44(fVar47,auVar124._0_4_);
                auVar45._8_4_ = fVar48 + auVar75._8_4_ + auVar99._8_4_ + auVar58._8_4_;
                auVar45._12_4_ = fVar49 + auVar75._12_4_ + auVar99._12_4_ + auVar58._12_4_;
                fVar48 = (float)DAT_00556310;
                fVar49 = DAT_00556310._4_4_;
                fVar155 = DAT_00556310._8_4_;
                fVar159 = DAT_00556310._12_4_;
                switch(uVar9) {
                case 1:
                  auVar45 = maxps(auVar45,_DAT_00553060);
                  break;
                case 2:
                  auVar64._8_4_ = auVar45._8_4_;
                  auVar64._0_8_ = auVar45._0_8_;
                  auVar64._12_4_ = auVar45._12_4_;
                  auVar146 = maxps(auVar64,ZEXT816(0));
                  auVar145 = minps(auVar45,ZEXT816(0));
                  auVar124._0_4_ = **(float **)(&this->field_0xe8 + (long)p_Var11);
                  auVar45._4_4_ = auVar124._0_4_ * auVar145._4_4_ + auVar146._4_4_;
                  auVar45._0_4_ = auVar124._0_4_ * auVar145._0_4_ + auVar146._0_4_;
                  auVar45._8_4_ = auVar124._0_4_ * auVar145._8_4_ + auVar146._8_4_;
                  auVar45._12_4_ = auVar124._0_4_ * auVar145._12_4_ + auVar146._12_4_;
                  break;
                case 3:
                  uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var11);
                  uVar6 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var11))[1];
                  auVar62._4_4_ = uVar7;
                  auVar62._0_4_ = uVar7;
                  auVar62._8_4_ = uVar7;
                  auVar62._12_4_ = uVar7;
                  auVar79._4_4_ = uVar6;
                  auVar79._0_4_ = uVar6;
                  auVar79._8_4_ = uVar6;
                  auVar79._12_4_ = uVar6;
                  auVar145 = maxps(auVar45,auVar62);
                  auVar45 = minps(auVar145,auVar79);
                  break;
                case 4:
                  auVar46._0_8_ = CONCAT44(fVar47,auVar124._0_4_) ^ 0x8000000080000000;
                  auVar46._8_4_ = -auVar45._8_4_;
                  auVar46._12_4_ = -auVar45._12_4_;
                  auVar145 = minps(auVar46,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar47 = auVar145._0_4_ * 1.442695 + fVar48;
                  fVar161 = auVar145._4_4_ * 1.442695 + fVar49;
                  fVar152 = auVar145._8_4_ * 1.442695 + fVar155;
                  fVar154 = auVar145._12_4_ * 1.442695 + fVar159;
                  auVar124._0_4_ = (float)(int)fVar47;
                  fVar160 = (float)(int)fVar161;
                  fVar140 = (float)(int)fVar152;
                  fVar153 = (float)(int)fVar154;
                  fVar162 = (float)DAT_00556320;
                  fVar163 = DAT_00556320._4_4_;
                  fVar164 = DAT_00556320._8_4_;
                  fVar165 = DAT_00556320._12_4_;
                  auVar124._0_4_ =
                       auVar124._0_4_ - (float)(-(uint)(fVar47 < auVar124._0_4_) & (uint)fVar162);
                  fVar160 = fVar160 - (float)(-(uint)(fVar161 < fVar160) & (uint)fVar163);
                  fVar140 = fVar140 - (float)(-(uint)(fVar152 < fVar140) & (uint)fVar164);
                  fVar153 = fVar153 - (float)(-(uint)(fVar154 < fVar153) & (uint)fVar165);
                  fVar47 = auVar124._0_4_ * -0.6931472 + auVar145._0_4_;
                  fVar161 = fVar160 * -0.6931472 + auVar145._4_4_;
                  fVar152 = fVar140 * -0.6931472 + auVar145._8_4_;
                  fVar154 = fVar153 * -0.6931472 + auVar145._12_4_;
                  auVar63._0_4_ =
                       fVar47 + fVar162 +
                       (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47
                         + 0.041665796) * fVar47 + 0.16666666) * fVar47 + fVar48) * fVar47 * fVar47;
                  auVar63._4_4_ =
                       fVar161 + fVar163 +
                       (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) *
                          fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + fVar49) *
                       fVar161 * fVar161;
                  auVar63._8_4_ =
                       fVar152 + fVar164 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar155) *
                       fVar152 * fVar152;
                  auVar63._12_4_ =
                       fVar154 + fVar165 +
                       (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                          fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + fVar159) *
                       fVar154 * fVar154;
                  auVar80._0_4_ =
                       (float)((int)auVar124._0_4_ * 0x800000 + (int)fVar162) * auVar63._0_4_ +
                       fVar162;
                  auVar80._4_4_ =
                       (float)((int)fVar160 * 0x800000 + (int)fVar163) * auVar63._4_4_ + fVar163;
                  auVar80._8_4_ =
                       (float)((int)fVar140 * 0x800000 + (int)fVar164) * auVar63._8_4_ + fVar164;
                  auVar80._12_4_ =
                       (float)((int)fVar153 * 0x800000 + (int)fVar165) * auVar63._12_4_ + fVar165;
                  auVar145 = rcpps(auVar63,auVar80);
                  auVar124._0_4_ = auVar145._0_4_;
                  fVar47 = auVar145._4_4_;
                  fVar48 = auVar145._8_4_;
                  fVar49 = auVar145._12_4_;
                  auVar45._0_4_ =
                       (fVar162 - auVar80._0_4_ * auVar124._0_4_) * auVar124._0_4_ + auVar124._0_4_;
                  auVar45._4_4_ = (fVar163 - auVar80._4_4_ * fVar47) * fVar47 + fVar47;
                  auVar45._8_4_ = (fVar164 - auVar80._8_4_ * fVar48) * fVar48 + fVar48;
                  auVar45._12_4_ = (fVar165 - auVar80._12_4_ * fVar49) * fVar49 + fVar49;
                  break;
                case 5:
                  auVar59._8_4_ = auVar45._8_4_;
                  auVar59._0_8_ = auVar45._0_8_;
                  auVar59._12_4_ = auVar45._12_4_;
                  auVar145 = minps(auVar59,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar160 = auVar145._0_4_ * 1.442695 + fVar48;
                  fVar161 = auVar145._4_4_ * 1.442695 + fVar49;
                  fVar140 = auVar145._8_4_ * 1.442695 + fVar155;
                  fVar152 = auVar145._12_4_ * 1.442695 + fVar159;
                  fVar153 = (float)(int)fVar160;
                  fVar154 = (float)(int)fVar161;
                  fVar162 = (float)(int)fVar140;
                  fVar163 = (float)(int)fVar152;
                  fVar153 = fVar153 - (float)(-(uint)(fVar160 < fVar153) & 0x3f800000);
                  fVar154 = fVar154 - (float)(-(uint)(fVar161 < fVar154) & 0x3f800000);
                  fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & 0x3f800000);
                  fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & 0x3f800000);
                  fVar160 = auVar145._0_4_ - fVar153 * 0.6931472;
                  fVar161 = auVar145._4_4_ - fVar154 * 0.6931472;
                  fVar140 = auVar145._8_4_ - fVar162 * 0.6931472;
                  fVar152 = auVar145._12_4_ - fVar163 * 0.6931472;
                  auVar76._0_4_ =
                       (float)((int)fVar153 * 0x800000 + 0x3f800000) *
                       (fVar160 + 1.0 +
                       (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) *
                          fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + fVar48) *
                       fVar160 * fVar160) + 1.0;
                  auVar76._4_4_ =
                       (float)((int)fVar154 * 0x800000 + 0x3f800000) *
                       (fVar161 + 1.0 +
                       (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) *
                          fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + fVar49) *
                       fVar161 * fVar161) + 1.0;
                  auVar76._8_4_ =
                       (float)((int)fVar162 * 0x800000 + 0x3f800000) *
                       (fVar140 + 1.0 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar155) *
                       fVar140 * fVar140) + 1.0;
                  auVar76._12_4_ =
                       (float)((int)fVar163 * 0x800000 + 0x3f800000) *
                       (fVar152 + 1.0 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar159) *
                       fVar152 * fVar152) + 1.0;
                  auVar145 = maxps(auVar76,_DAT_00556390);
                  auVar77._0_8_ = auVar145._0_8_ & 0x807fffff807fffff;
                  auVar77._8_4_ = auVar145._8_4_ & 0x807fffff;
                  auVar77._12_4_ = auVar145._12_4_ & 0x807fffff;
                  auVar77 = auVar77 | _DAT_00556310;
                  fVar160 = auVar77._0_4_;
                  fVar140 = auVar77._4_4_;
                  fVar153 = auVar77._8_4_;
                  fVar162 = auVar77._12_4_;
                  fVar161 = fVar160 + (float)DAT_005563d0 +
                            (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
                  fVar152 = fVar140 + DAT_005563d0._4_4_ +
                            (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
                  fVar154 = fVar153 + DAT_005563d0._8_4_ +
                            (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar153);
                  fVar163 = fVar162 + DAT_005563d0._12_4_ +
                            (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
                  auVar78._0_4_ =
                       ~-(uint)(auVar76._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar160 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar161 +
                              (((((((((fVar161 * 0.070376836 + -0.1151461) * fVar161 + 0.116769984)
                                     * fVar161 + -0.12420141) * fVar161 + 0.14249323) * fVar161 +
                                  -0.16668057) * fVar161 + 0.20000714) * fVar161 + -0.24999994) *
                                fVar161 + 0.3333333) * fVar161 + -0.5) * fVar161 * fVar161) * -2.0);
                  auVar78._4_4_ =
                       ~-(uint)(auVar76._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar152 +
                              (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984)
                                     * fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                                  -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) *
                                fVar152 + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
                  auVar78._8_4_ =
                       ~-(uint)(auVar76._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar153 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar154 +
                              (((((((((fVar154 * 0.070376836 + -0.1151461) * fVar154 + 0.116769984)
                                     * fVar154 + -0.12420141) * fVar154 + 0.14249323) * fVar154 +
                                  -0.16668057) * fVar154 + 0.20000714) * fVar154 + -0.24999994) *
                                fVar154 + 0.3333333) * fVar154 + -0.5) * fVar154 * fVar154) * -2.0);
                  auVar78._12_4_ =
                       ~-(uint)(auVar76._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar145._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar162 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar163 +
                              (((((((((fVar163 * 0.070376836 + -0.1151461) * fVar163 + 0.116769984)
                                     * fVar163 + -0.12420141) * fVar163 + 0.14249323) * fVar163 +
                                  -0.16668057) * fVar163 + 0.20000714) * fVar163 + -0.24999994) *
                                fVar163 + 0.3333333) * fVar163 + -0.5) * fVar163 * fVar163) * -2.0);
                  auVar60._0_8_ =
                       CONCAT44(-(uint)(auVar76._4_4_ <= 0.0),-(uint)(auVar76._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar60._8_4_ = -(uint)(auVar76._8_4_ <= 0.0) & 0x7fffffff;
                  auVar60._12_4_ = -(uint)(auVar76._12_4_ <= 0.0) & 0x7fffffff;
                  auVar145 = minps(auVar60 | auVar78,_DAT_005562e0);
                  auVar145 = maxps(auVar145,_DAT_005562f0);
                  fVar160 = auVar145._0_4_ * 1.442695 + fVar48;
                  fVar161 = auVar145._4_4_ * 1.442695 + fVar49;
                  fVar140 = auVar145._8_4_ * 1.442695 + fVar155;
                  fVar152 = auVar145._12_4_ * 1.442695 + fVar159;
                  fVar153 = (float)(int)fVar160;
                  fVar154 = (float)(int)fVar161;
                  fVar162 = (float)(int)fVar140;
                  fVar163 = (float)(int)fVar152;
                  fVar153 = fVar153 - (float)(-(uint)(fVar160 < fVar153) & 0x3f800000);
                  fVar154 = fVar154 - (float)(-(uint)(fVar161 < fVar154) & 0x3f800000);
                  fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & 0x3f800000);
                  fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & 0x3f800000);
                  fVar160 = auVar145._0_4_ - fVar153 * 0.6931472;
                  fVar161 = auVar145._4_4_ - fVar154 * 0.6931472;
                  fVar140 = auVar145._8_4_ - fVar162 * 0.6931472;
                  fVar152 = auVar145._12_4_ - fVar163 * 0.6931472;
                  auVar61._0_4_ =
                       fVar160 + 1.0 +
                       (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) *
                          fVar160 + 0.041665796) * fVar160 + 0.16666666) * fVar160 + fVar48) *
                       fVar160 * fVar160;
                  auVar61._4_4_ =
                       fVar161 + 1.0 +
                       (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) *
                          fVar161 + 0.041665796) * fVar161 + 0.16666666) * fVar161 + fVar49) *
                       fVar161 * fVar161;
                  auVar61._8_4_ =
                       fVar140 + 1.0 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar155) *
                       fVar140 * fVar140;
                  auVar61._12_4_ =
                       fVar152 + 1.0 +
                       (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                          fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar159) *
                       fVar152 * fVar152;
                  auVar100._0_4_ =
                       (float)((int)fVar153 * 0x800000 + 0x3f800000) * auVar61._0_4_ + 1.0;
                  auVar100._4_4_ =
                       (float)((int)fVar154 * 0x800000 + 0x3f800000) * auVar61._4_4_ + 1.0;
                  auVar100._8_4_ =
                       (float)((int)fVar162 * 0x800000 + 0x3f800000) * auVar61._8_4_ + 1.0;
                  auVar100._12_4_ =
                       (float)((int)fVar163 * 0x800000 + 0x3f800000) * auVar61._12_4_ + 1.0;
                  auVar145 = rcpps(auVar61,auVar100);
                  fVar48 = auVar145._0_4_;
                  fVar49 = auVar145._4_4_;
                  fVar155 = auVar145._8_4_;
                  fVar159 = auVar145._12_4_;
                  auVar45._0_4_ =
                       auVar124._0_4_ *
                       (fVar48 + fVar48 + (float)DAT_005563d0 +
                       (2.0 - auVar100._0_4_ * (fVar48 + fVar48)) * fVar48);
                  auVar45._4_4_ =
                       fVar47 * (fVar49 + fVar49 + DAT_005563d0._4_4_ +
                                (2.0 - auVar100._4_4_ * (fVar49 + fVar49)) * fVar49);
                  auVar45._8_4_ =
                       auVar45._8_4_ *
                       (fVar155 + fVar155 + DAT_005563d0._8_4_ +
                       (2.0 - auVar100._8_4_ * (fVar155 + fVar155)) * fVar155);
                  auVar45._12_4_ =
                       auVar45._12_4_ *
                       (fVar159 + fVar159 + DAT_005563d0._12_4_ +
                       (2.0 - auVar100._12_4_ * (fVar159 + fVar159)) * fVar159);
                  break;
                case 6:
                  fVar48 = **(float **)(&this->field_0xe8 + (long)p_Var11);
                  fVar49 = (*(float **)(&this->field_0xe8 + (long)p_Var11))[1];
                  auVar65._0_4_ = fVar48 * auVar124._0_4_ + fVar49;
                  auVar65._4_4_ = fVar48 * fVar47 + fVar49;
                  auVar65._8_4_ = fVar48 * auVar45._8_4_ + fVar49;
                  auVar65._12_4_ = fVar48 * auVar45._12_4_ + fVar49;
                  auVar145 = maxps(auVar65,_DAT_00553060);
                  auVar145 = minps(auVar145,_DAT_00556320);
                  auVar45._0_4_ = auVar124._0_4_ * auVar145._0_4_;
                  auVar45._4_4_ = fVar47 * auVar145._4_4_;
                  auVar45._8_4_ = auVar45._8_4_ * auVar145._8_4_;
                  auVar45._12_4_ = auVar45._12_4_ * auVar145._12_4_;
                }
                *pauVar22 = auVar45;
                pauVar22 = pauVar22 + 1;
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar37);
              goto LAB_00299463;
            }
          }
          else {
LAB_00299463:
            if ((0 < (int)uVar37 && iVar21 == 1) && bVar24 == 0) {
              pfVar38 = (float *)(top_blob->w * lVar39 * top_blob->elemsize + (long)top_blob->data);
              pvVar13 = (this->weight_data_tm).data;
              pfVar40 = (float *)(bottom_blob->w * lVar39 * bottom_blob->elemsize +
                                 (long)bottom_blob->data);
              pfVar29 = *(float **)(&this->field_0xe8 + (long)p_Var11);
              uVar25 = 0;
              do {
                if (lVar12 == 0) {
                  auVar124._0_4_ = 0.0;
                }
                else {
                  auVar124._0_4_ = *(float *)(lVar12 + uVar25 * 4);
                }
                pfVar23 = (float *)(uVar25 * (long)(int)uVar10 * 4 + (long)pvVar13);
                pfVar26 = pfVar40;
                if ((int)uVar10 < 4) {
                  uVar34 = 0;
                  auVar66 = ZEXT816(0);
                }
                else {
                  iVar32 = 3;
                  auVar145 = ZEXT816(0);
                  do {
                    auVar66._0_4_ = auVar145._0_4_ + *pfVar23 * *pfVar26;
                    auVar66._4_4_ = auVar145._4_4_ + pfVar23[1] * pfVar26[1];
                    auVar66._8_4_ = auVar145._8_4_ + pfVar23[2] * pfVar26[2];
                    auVar66._12_4_ = auVar145._12_4_ + pfVar23[3] * pfVar26[3];
                    pfVar26 = pfVar26 + 4;
                    pfVar23 = pfVar23 + 4;
                    iVar32 = iVar32 + 4;
                    auVar145 = auVar66;
                  } while (iVar32 < (int)uVar10);
                  uVar34 = uVar10 & 0xfffffffc;
                }
                if ((int)uVar34 < (int)uVar10) {
                  lVar28 = 0;
                  do {
                    auVar124._0_4_ = auVar124._0_4_ + pfVar23[lVar28] * pfVar26[lVar28];
                    lVar28 = lVar28 + 1;
                  } while (uVar10 - uVar34 != (int)lVar28);
                }
                fVar47 = auVar66._12_4_ + auVar66._4_4_;
                auVar123._4_4_ = fVar47;
                auVar123._0_4_ = fVar47;
                auVar123._8_4_ = fVar47;
                auVar123._12_4_ = fVar47;
                auVar124._4_12_ = auVar123._4_12_;
                auVar124._0_4_ = fVar47 + auVar66._8_4_ + auVar66._0_4_ + auVar124._0_4_;
                switch(uVar9) {
                case 1:
                  if (auVar124._0_4_ <= 0.0) {
                    auVar17._12_4_ = 0;
                    auVar17._0_12_ = auVar124._4_12_;
                    auVar124 = auVar17 << 0x20;
                  }
                default:
switchD_00299567_default:
                  fVar47 = auVar124._0_4_;
                  break;
                case 2:
                  fVar47 = (float)(~-(uint)(0.0 < auVar124._0_4_) & (uint)*pfVar29 |
                                  -(uint)(0.0 < auVar124._0_4_) & 0x3f800000) * auVar124._0_4_;
                  break;
                case 3:
                  if (auVar124._0_4_ <= *pfVar29) {
                    auVar124._0_4_ = *pfVar29;
                  }
                  fVar47 = pfVar29[1];
                  if (auVar124._0_4_ <= fVar47) {
                    fVar47 = auVar124._0_4_;
                  }
                  break;
                case 4:
                  if (88.37626 <= auVar124._0_4_) {
                    auVar124._0_4_ = 88.37626;
                  }
                  auVar124._0_4_ =
                       expf((float)(-(uint)(auVar124._0_4_ < -88.37626) & 0x42b0c0a5 |
                                   ~-(uint)(auVar124._0_4_ < -88.37626) & (uint)-auVar124._0_4_));
                  fVar47 = 1.0 / (auVar124._0_4_ + 1.0);
                  break;
                case 5:
                  local_98 = auVar124;
                  auVar124._0_4_ = expf(auVar124._0_4_);
                  auVar124._0_4_ = logf(auVar124._0_4_ + 1.0);
                  auVar124._0_4_ = tanhf(auVar124._0_4_);
                  fVar47 = auVar124._0_4_ * (float)local_98._0_4_;
                  break;
                case 6:
                  fVar48 = *pfVar29;
                  fVar49 = -pfVar29[1] / fVar48;
                  fVar47 = 0.0;
                  if (fVar49 <= auVar124._0_4_) {
                    if (fVar49 + 1.0 / fVar48 < auVar124._0_4_) goto switchD_00299567_default;
                    fVar47 = (fVar48 * auVar124._0_4_ + pfVar29[1]) * auVar124._0_4_;
                  }
                }
                *pfVar38 = fVar47;
                pfVar38 = pfVar38 + 1;
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar37);
            }
          }
          lVar39 = lVar39 + 1;
        } while (lVar39 != local_80);
      }
      return 0;
    }
  }
  else {
    local_b4 = bottom_blob->w;
  }
  local_e0 = (float *)bottom_blob->data;
  local_d8 = bottom_blob->refcount;
  local_d0 = bottom_blob->elemsize;
  local_c8 = bottom_blob->elempack;
  local_c0 = bottom_blob->allocator;
  local_b0._0_4_ = bottom_blob->h;
  local_b0._4_4_ = bottom_blob->d;
  local_a8 = bottom_blob->c;
  local_a0 = bottom_blob->cstep;
  iVar21 = local_b8;
  if (local_d8 != (int *)0x0) {
    LOCK();
    *local_d8 = *local_d8 + 1;
    UNLOCK();
    iVar21 = bottom_blob->dims;
  }
  if (iVar21 != 1) {
    local_78._0_1_ = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78._4_4_ = opt->num_threads;
    local_68 = opt->workspace_allocator;
    uStack_60._0_4_ = opt->openmp_blocktime;
    uStack_60._4_1_ = opt->use_winograd_convolution;
    uStack_60._5_1_ = opt->use_sgemm_convolution;
    uStack_60._6_1_ = opt->use_int8_inference;
    uStack_60._7_1_ = opt->use_vulkan_compute;
    local_58[0] = opt->use_bf16_storage;
    local_58[1] = opt->use_fp16_packed;
    local_58[2] = opt->use_fp16_storage;
    local_58[3] = opt->use_fp16_arithmetic;
    local_58[4] = opt->use_int8_packed;
    local_58[5] = opt->use_int8_storage;
    local_58[6] = opt->use_int8_arithmetic;
    local_58[7] = opt->use_packing_layout;
    local_58[8] = opt->use_shader_pack8;
    local_58[9] = opt->use_subgroup_basic;
    local_58[10] = opt->use_subgroup_vote;
    local_58[0xb] = opt->use_subgroup_ballot;
    local_58[0xc] = opt->use_subgroup_shuffle;
    local_58[0xd] = opt->use_image_storage;
    local_58[0xe] = opt->use_tensor_storage;
    local_58[0xf] = opt->use_reserved_0;
    local_48._0_4_ = opt->flush_denormals;
    local_48[4] = opt->use_local_pool_allocator;
    local_48[5] = opt->use_shader_local_memory;
    local_48[6] = opt->use_cooperative_matrix;
    local_48[7] = opt->use_winograd23_convolution;
    local_48[8] = opt->use_winograd43_convolution;
    local_48[9] = opt->use_winograd63_convolution;
    local_48[10] = opt->use_a53_a55_optimized_kernel;
    local_48[0xb] = opt->use_reserved_7;
    local_48[0xc] = opt->use_reserved_8;
    local_48[0xd] = opt->use_reserved_9;
    local_48[0xe] = opt->use_reserved_10;
    local_48[0xf] = opt->use_reserved_11;
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_e0);
  }
  bVar24 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) & 3) == 0 &
           opt->use_packing_layout;
  iVar21 = (uint)bVar24 + (uint)bVar24 * 2 + 1;
  Mat::create(top_blob,(int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) /
                       iVar21,local_d0 / (ulong)(long)local_c8 << bVar24 * '\x02',iVar21,
              opt->blob_allocator);
  pfVar29 = local_e0;
  auVar145 = _DAT_00556320;
  iVar21 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    p_Var11 = this->_vptr_InnerProduct_x86[-3];
    uVar9 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var11);
    lVar12 = *(long *)(&this->field_0x178 + (long)p_Var11);
    uVar37 = local_c8 * local_b4;
    uVar10 = top_blob->w;
    auVar124._0_4_ = (float)DAT_00556320;
    fVar47 = DAT_00556320._4_4_;
    fVar48 = DAT_00556320._8_4_;
    fVar49 = DAT_00556320._12_4_;
    if (top_blob->elempack == 1) {
      lVar39 = (long)(int)uVar37;
      if (0 < (int)uVar10 >> 2) {
        local_98._0_4_ = uVar37 & 0xfffffffc;
        lVar27 = lVar39 * 0x10;
        lVar28 = lVar39 * 4;
        lVar35 = lVar39 * 0xc;
        lVar33 = lVar39 * 8;
        lVar36 = 0;
        uVar25 = 0;
        do {
          uVar5 = uVar25 * 4;
          fVar155 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          fVar161 = 0.0;
          if (lVar12 != 0) {
            pfVar38 = (float *)(lVar12 + uVar25 * 0x10);
            fVar155 = *pfVar38;
            fVar159 = pfVar38[1];
            fVar160 = pfVar38[2];
            fVar161 = pfVar38[3];
          }
          pvVar13 = (this->weight_data_tm).data;
          if ((int)uVar37 < 4) {
            uVar34 = 0;
            lVar1 = uVar5 * lVar39 * 4;
            lVar2 = (uVar5 | 1) * lVar39 * 4;
            lVar3 = (uVar5 | 2) * lVar39 * 4;
            lVar4 = (uVar5 | 3) * lVar39 * 4;
            fVar140 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            fVar154 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar165 = 0.0;
            fVar166 = 0.0;
            fVar168 = 0.0;
            fVar170 = 0.0;
            fVar172 = 0.0;
            fVar167 = 0.0;
            fVar169 = 0.0;
            fVar171 = 0.0;
            fVar173 = 0.0;
            pfVar38 = local_e0;
          }
          else {
            fVar167 = 0.0;
            fVar169 = 0.0;
            fVar171 = 0.0;
            fVar173 = 0.0;
            iVar21 = 3;
            lVar30 = 0;
            fVar166 = 0.0;
            fVar168 = 0.0;
            fVar170 = 0.0;
            fVar172 = 0.0;
            fVar162 = 0.0;
            fVar163 = 0.0;
            fVar164 = 0.0;
            fVar165 = 0.0;
            fVar140 = 0.0;
            fVar152 = 0.0;
            fVar153 = 0.0;
            fVar154 = 0.0;
            do {
              pfVar38 = (float *)((long)local_e0 + lVar30);
              fVar8 = *pfVar38;
              fVar18 = pfVar38[1];
              fVar19 = pfVar38[2];
              fVar20 = pfVar38[3];
              pfVar38 = (float *)((long)pvVar13 + lVar30 + lVar36);
              pfVar40 = (float *)((long)pvVar13 + lVar30 + lVar28);
              pfVar26 = (float *)((long)pvVar13 + lVar30 + lVar33);
              pfVar23 = (float *)((long)pvVar13 + lVar30 + lVar35);
              fVar167 = fVar167 + *pfVar38 * fVar8;
              fVar169 = fVar169 + pfVar38[1] * fVar18;
              fVar171 = fVar171 + pfVar38[2] * fVar19;
              fVar173 = fVar173 + pfVar38[3] * fVar20;
              fVar140 = fVar140 + *pfVar40 * fVar8;
              fVar152 = fVar152 + pfVar40[1] * fVar18;
              fVar153 = fVar153 + pfVar40[2] * fVar19;
              fVar154 = fVar154 + pfVar40[3] * fVar20;
              fVar162 = fVar162 + *pfVar26 * fVar8;
              fVar163 = fVar163 + pfVar26[1] * fVar18;
              fVar164 = fVar164 + pfVar26[2] * fVar19;
              fVar165 = fVar165 + pfVar26[3] * fVar20;
              fVar166 = fVar166 + *pfVar23 * fVar8;
              fVar168 = fVar168 + pfVar23[1] * fVar18;
              fVar170 = fVar170 + pfVar23[2] * fVar19;
              fVar172 = fVar172 + pfVar23[3] * fVar20;
              lVar30 = lVar30 + 0x10;
              iVar21 = iVar21 + 4;
            } while (iVar21 < (int)uVar37);
            lVar1 = lVar30 + lVar36;
            lVar4 = lVar30 + lVar35;
            lVar3 = lVar30 + lVar33;
            lVar2 = lVar30 + lVar28;
            pfVar38 = (float *)((long)local_e0 + lVar30);
            uVar34 = uVar37 & 0xfffffffc;
          }
          if (uVar37 - uVar34 != 0 && (int)uVar34 <= (int)uVar37) {
            lVar30 = 0;
            do {
              fVar8 = pfVar38[lVar30];
              fVar155 = fVar155 + fVar8 * *(float *)((long)pvVar13 + lVar30 * 4 + lVar1);
              fVar159 = fVar159 + fVar8 * *(float *)((long)pvVar13 + lVar30 * 4 + lVar2);
              fVar160 = fVar160 + fVar8 * *(float *)((long)pvVar13 + lVar30 * 4 + lVar3);
              fVar161 = fVar161 + fVar8 * *(float *)((long)pvVar13 + lVar30 * 4 + lVar4);
              lVar30 = lVar30 + 1;
            } while (uVar37 - uVar34 != (int)lVar30);
          }
          fVar155 = fVar173 + fVar171 + fVar169 + fVar167 + fVar155;
          fVar159 = fVar154 + fVar153 + fVar152 + fVar140 + fVar159;
          auVar150._0_8_ = CONCAT44(fVar159,fVar155);
          auVar150._8_4_ = fVar165 + fVar164 + fVar163 + fVar162 + fVar160;
          auVar150._12_4_ = fVar172 + fVar170 + fVar168 + fVar166 + fVar161;
          switch(uVar9) {
          case 1:
            auVar150 = maxps(auVar150,ZEXT816(0));
            break;
          case 2:
            auVar93._8_4_ = auVar150._8_4_;
            auVar93._0_8_ = auVar150._0_8_;
            auVar93._12_4_ = auVar150._12_4_;
            auVar146 = maxps(auVar93,ZEXT816(0));
            auVar147 = minps(auVar150,ZEXT816(0));
            fVar155 = **(float **)(&this->field_0xe8 + (long)p_Var11);
            auVar150._4_4_ = fVar155 * auVar147._4_4_ + auVar146._4_4_;
            auVar150._0_4_ = fVar155 * auVar147._0_4_ + auVar146._0_4_;
            auVar150._8_4_ = fVar155 * auVar147._8_4_ + auVar146._8_4_;
            auVar150._12_4_ = fVar155 * auVar147._12_4_ + auVar146._12_4_;
            break;
          case 3:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var11);
            uVar6 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var11))[1];
            auVar91._4_4_ = uVar7;
            auVar91._0_4_ = uVar7;
            auVar91._8_4_ = uVar7;
            auVar91._12_4_ = uVar7;
            auVar104._4_4_ = uVar6;
            auVar104._0_4_ = uVar6;
            auVar104._8_4_ = uVar6;
            auVar104._12_4_ = uVar6;
            auVar146 = maxps(auVar150,auVar91);
            auVar150 = minps(auVar146,auVar104);
            break;
          case 4:
            auVar151._0_8_ = CONCAT44(fVar159,fVar155) ^ 0x8000000080000000;
            auVar151._8_4_ = -auVar150._8_4_;
            auVar151._12_4_ = -auVar150._12_4_;
            auVar146 = minps(auVar151,_DAT_005562e0);
            auVar146 = maxps(auVar146,_DAT_005562f0);
            fVar159 = auVar146._0_4_ * 1.442695 + 0.5;
            fVar161 = auVar146._4_4_ * 1.442695 + 0.5;
            fVar152 = auVar146._8_4_ * 1.442695 + 0.5;
            fVar154 = auVar146._12_4_ * 1.442695 + 0.5;
            fVar155 = (float)(int)fVar159;
            fVar160 = (float)(int)fVar161;
            fVar140 = (float)(int)fVar152;
            fVar153 = (float)(int)fVar154;
            fVar155 = fVar155 - (float)(-(uint)(fVar159 < fVar155) & (uint)auVar124._0_4_);
            fVar160 = fVar160 - (float)(-(uint)(fVar161 < fVar160) & (uint)fVar47);
            fVar140 = fVar140 - (float)(-(uint)(fVar152 < fVar140) & (uint)fVar48);
            fVar153 = fVar153 - (float)(-(uint)(fVar154 < fVar153) & (uint)fVar49);
            fVar159 = fVar155 * -0.6931472 + auVar146._0_4_;
            fVar161 = fVar160 * -0.6931472 + auVar146._4_4_;
            fVar152 = fVar140 * -0.6931472 + auVar146._8_4_;
            fVar154 = fVar153 * -0.6931472 + auVar146._12_4_;
            auVar92._0_4_ =
                 fVar159 + auVar124._0_4_ +
                 (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                   0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5) * fVar159 * fVar159;
            auVar92._4_4_ =
                 fVar161 + fVar47 +
                 (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                   0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5) * fVar161 * fVar161;
            auVar92._8_4_ =
                 fVar152 + fVar48 +
                 (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                   0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152;
            auVar92._12_4_ =
                 fVar154 + fVar49 +
                 (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) * fVar154 +
                   0.041665796) * fVar154 + 0.16666666) * fVar154 + 0.5) * fVar154 * fVar154;
            auVar105._0_4_ =
                 (float)((int)fVar155 * 0x800000 + (int)auVar124._0_4_) * auVar92._0_4_ +
                 auVar124._0_4_;
            auVar105._4_4_ = (float)((int)fVar160 * 0x800000 + (int)fVar47) * auVar92._4_4_ + fVar47
            ;
            auVar105._8_4_ = (float)((int)fVar140 * 0x800000 + (int)fVar48) * auVar92._8_4_ + fVar48
            ;
            auVar105._12_4_ =
                 (float)((int)fVar153 * 0x800000 + (int)fVar49) * auVar92._12_4_ + fVar49;
            auVar146 = rcpps(auVar92,auVar105);
            fVar155 = auVar146._0_4_;
            fVar159 = auVar146._4_4_;
            fVar160 = auVar146._8_4_;
            fVar161 = auVar146._12_4_;
            auVar150._0_4_ = (auVar124._0_4_ - auVar105._0_4_ * fVar155) * fVar155 + fVar155;
            auVar150._4_4_ = (fVar47 - auVar105._4_4_ * fVar159) * fVar159 + fVar159;
            auVar150._8_4_ = (fVar48 - auVar105._8_4_ * fVar160) * fVar160 + fVar160;
            auVar150._12_4_ = (fVar49 - auVar105._12_4_ * fVar161) * fVar161 + fVar161;
            break;
          case 5:
            auVar157._8_4_ = auVar150._8_4_;
            auVar157._0_8_ = auVar150._0_8_;
            auVar157._12_4_ = auVar150._12_4_;
            auVar146 = minps(auVar157,_DAT_005562e0);
            auVar146 = maxps(auVar146,_DAT_005562f0);
            fVar160 = auVar146._0_4_ * 1.442695 + 0.5;
            fVar161 = auVar146._4_4_ * 1.442695 + 0.5;
            fVar140 = auVar146._8_4_ * 1.442695 + 0.5;
            fVar152 = auVar146._12_4_ * 1.442695 + 0.5;
            fVar153 = (float)(int)fVar160;
            fVar154 = (float)(int)fVar161;
            fVar162 = (float)(int)fVar140;
            fVar163 = (float)(int)fVar152;
            fVar153 = fVar153 - (float)(-(uint)(fVar160 < fVar153) & (uint)auVar124._0_4_);
            fVar154 = fVar154 - (float)(-(uint)(fVar161 < fVar154) & (uint)fVar47);
            fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & (uint)fVar48);
            fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & (uint)fVar49);
            fVar160 = auVar146._0_4_ - fVar153 * 0.6931472;
            fVar161 = auVar146._4_4_ - fVar154 * 0.6931472;
            fVar140 = auVar146._8_4_ - fVar162 * 0.6931472;
            fVar152 = auVar146._12_4_ - fVar163 * 0.6931472;
            auVar88._0_4_ =
                 (float)((int)fVar153 * 0x800000 + (int)auVar124._0_4_) *
                 (fVar160 + auVar124._0_4_ +
                 (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                   0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160) +
                 auVar124._0_4_;
            auVar88._4_4_ =
                 (float)((int)fVar154 * 0x800000 + (int)fVar47) *
                 (fVar161 + fVar47 +
                 (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                   0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5) * fVar161 * fVar161) +
                 fVar47;
            auVar88._8_4_ =
                 (float)((int)fVar162 * 0x800000 + (int)fVar48) *
                 (fVar140 + fVar48 +
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) +
                 fVar48;
            auVar88._12_4_ =
                 (float)((int)fVar163 * 0x800000 + (int)fVar49) *
                 (fVar152 + fVar49 +
                 (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                   0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152) +
                 fVar49;
            auVar146 = maxps(auVar88,_DAT_00556390);
            fVar160 = (float)(auVar146._0_4_ & 0x807fffff | 0x3f000000);
            fVar140 = (float)(auVar146._4_4_ & 0x807fffff | 0x3f000000);
            fVar153 = (float)(auVar146._8_4_ & 0x807fffff | 0x3f000000);
            fVar162 = (float)(auVar146._12_4_ & 0x807fffff | 0x3f000000);
            fVar161 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
            fVar152 = fVar140 + -1.0 + (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
            fVar154 = fVar153 + -1.0 + (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar153);
            fVar163 = fVar162 + -1.0 + (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
            auVar89._0_4_ =
                 ~-(uint)(auVar88._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar146._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar160 < 0.70710677) & (uint)auVar124._0_4_)) * 0.6931472
                         + fVar161 +
                        (((((((((fVar161 * 0.070376836 + -0.1151461) * fVar161 + 0.116769984) *
                               fVar161 + -0.12420141) * fVar161 + 0.14249323) * fVar161 +
                            -0.16668057) * fVar161 + 0.20000714) * fVar161 + -0.24999994) * fVar161
                         + 0.3333333) * fVar161 + -0.5) * fVar161 * fVar161) * -2.0);
            auVar89._4_4_ =
                 ~-(uint)(auVar88._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar146._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar47)) * 0.6931472 +
                         fVar152 +
                        (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) *
                               fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                            -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) * fVar152
                         + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
            auVar89._8_4_ =
                 ~-(uint)(auVar88._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar146._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar48)) * 0.6931472 +
                         fVar154 +
                        (((((((((fVar154 * 0.070376836 + -0.1151461) * fVar154 + 0.116769984) *
                               fVar154 + -0.12420141) * fVar154 + 0.14249323) * fVar154 +
                            -0.16668057) * fVar154 + 0.20000714) * fVar154 + -0.24999994) * fVar154
                         + 0.3333333) * fVar154 + -0.5) * fVar154 * fVar154) * -2.0);
            auVar89._12_4_ =
                 ~-(uint)(auVar88._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar146._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar49)) * 0.6931472 +
                         fVar163 +
                        (((((((((fVar163 * 0.070376836 + -0.1151461) * fVar163 + 0.116769984) *
                               fVar163 + -0.12420141) * fVar163 + 0.14249323) * fVar163 +
                            -0.16668057) * fVar163 + 0.20000714) * fVar163 + -0.24999994) * fVar163
                         + 0.3333333) * fVar163 + -0.5) * fVar163 * fVar163) * -2.0);
            auVar158._0_8_ =
                 CONCAT44(-(uint)(auVar88._4_4_ <= 0.0),-(uint)(auVar88._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar158._8_4_ = -(uint)(auVar88._8_4_ <= 0.0) & 0x7fffffff;
            auVar158._12_4_ = -(uint)(auVar88._12_4_ <= 0.0) & 0x7fffffff;
            auVar146 = minps(auVar158 | auVar89,_DAT_005562e0);
            auVar146 = maxps(auVar146,_DAT_005562f0);
            fVar153 = auVar146._0_4_ * 1.442695 + 0.5;
            fVar154 = auVar146._4_4_ * 1.442695 + 0.5;
            fVar162 = auVar146._8_4_ * 1.442695 + 0.5;
            fVar163 = auVar146._12_4_ * 1.442695 + 0.5;
            fVar160 = (float)(int)fVar153;
            fVar161 = (float)(int)fVar154;
            fVar140 = (float)(int)fVar162;
            fVar152 = (float)(int)fVar163;
            fVar160 = fVar160 - (float)(-(uint)(fVar153 < fVar160) & (uint)auVar124._0_4_);
            fVar161 = fVar161 - (float)(-(uint)(fVar154 < fVar161) & (uint)fVar47);
            fVar140 = fVar140 - (float)(-(uint)(fVar162 < fVar140) & (uint)fVar48);
            fVar152 = fVar152 - (float)(-(uint)(fVar163 < fVar152) & (uint)fVar49);
            fVar153 = auVar146._0_4_ - fVar160 * 0.6931472;
            fVar154 = auVar146._4_4_ - fVar161 * 0.6931472;
            fVar162 = auVar146._8_4_ - fVar140 * 0.6931472;
            fVar163 = auVar146._12_4_ - fVar152 * 0.6931472;
            auVar90._0_4_ = fVar153 * fVar153;
            auVar90._4_4_ = fVar154 * fVar154;
            auVar90._8_4_ = fVar162 * fVar162;
            auVar90._12_4_ = fVar163 * fVar163;
            fVar153 = (float)((int)fVar160 * 0x800000 + (int)auVar124._0_4_) *
                      (fVar153 + auVar124._0_4_ +
                      (((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                         fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153 + 0.5) *
                      auVar90._0_4_) + auVar124._0_4_;
            fVar154 = (float)((int)fVar161 * 0x800000 + (int)fVar47) *
                      (fVar154 + fVar47 +
                      (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) *
                         fVar154 + 0.041665796) * fVar154 + 0.16666666) * fVar154 + 0.5) *
                      auVar90._4_4_) + fVar47;
            fVar162 = (float)((int)fVar140 * 0x800000 + (int)fVar48) *
                      (fVar162 + fVar48 +
                      (((((fVar162 * 0.00019875691 + 0.0013981999) * fVar162 + 0.008333452) *
                         fVar162 + 0.041665796) * fVar162 + 0.16666666) * fVar162 + 0.5) *
                      auVar90._8_4_) + fVar48;
            fVar163 = (float)((int)fVar152 * 0x800000 + (int)fVar49) *
                      (fVar163 + fVar49 +
                      (((((fVar163 * 0.00019875691 + 0.0013981999) * fVar163 + 0.008333452) *
                         fVar163 + 0.041665796) * fVar163 + 0.16666666) * fVar163 + 0.5) *
                      auVar90._12_4_) + fVar49;
            auVar16._4_4_ = fVar154;
            auVar16._0_4_ = fVar153;
            auVar16._8_4_ = fVar162;
            auVar16._12_4_ = fVar163;
            auVar146 = rcpps(auVar90,auVar16);
            fVar160 = auVar146._0_4_;
            fVar161 = auVar146._4_4_;
            fVar140 = auVar146._8_4_;
            fVar152 = auVar146._12_4_;
            auVar150._0_4_ =
                 fVar155 * (fVar160 + fVar160 + -1.0 +
                           (2.0 - fVar153 * (fVar160 + fVar160)) * fVar160);
            auVar150._4_4_ =
                 fVar159 * (fVar161 + fVar161 + -1.0 +
                           (2.0 - fVar154 * (fVar161 + fVar161)) * fVar161);
            auVar150._8_4_ =
                 auVar150._8_4_ *
                 (fVar140 + fVar140 + -1.0 + (2.0 - fVar162 * (fVar140 + fVar140)) * fVar140);
            auVar150._12_4_ =
                 auVar150._12_4_ *
                 (fVar152 + fVar152 + -1.0 + (2.0 - fVar163 * (fVar152 + fVar152)) * fVar152);
            break;
          case 6:
            fVar160 = **(float **)(&this->field_0xe8 + (long)p_Var11);
            fVar161 = (*(float **)(&this->field_0xe8 + (long)p_Var11))[1];
            auVar94._0_4_ = fVar160 * fVar155 + fVar161;
            auVar94._4_4_ = fVar160 * fVar159 + fVar161;
            auVar94._8_4_ = fVar160 * auVar150._8_4_ + fVar161;
            auVar94._12_4_ = fVar160 * auVar150._12_4_ + fVar161;
            auVar146 = maxps(auVar94,ZEXT816(0));
            auVar146 = minps(auVar146,auVar145);
            auVar150._0_4_ = fVar155 * auVar146._0_4_;
            auVar150._4_4_ = fVar159 * auVar146._4_4_;
            auVar150._8_4_ = auVar150._8_4_ * auVar146._8_4_;
            auVar150._12_4_ = auVar150._12_4_ * auVar146._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar25 * 0x10) = auVar150;
          uVar25 = uVar25 + 1;
          lVar36 = lVar36 + lVar27;
          lVar35 = lVar35 + lVar27;
          lVar33 = lVar33 + lVar27;
          lVar28 = lVar28 + lVar27;
        } while (uVar25 != (uint)((int)uVar10 >> 2));
      }
      uVar25 = (long)(int)uVar10 & 0xfffffffffffffffc;
      iVar21 = 0;
      if ((uint)uVar25 == uVar10) goto LAB_0029a572;
      pvVar13 = (this->weight_data_tm).data;
      pfVar38 = *(float **)(&this->field_0xe8 + (long)p_Var11);
      pvVar14 = top_blob->data;
      local_148 = uVar37 & 0xfffffffc;
      do {
        auVar124._0_4_ = 0.0;
        if (lVar12 != 0) {
          auVar124._0_4_ = *(float *)(lVar12 + uVar25 * 4);
        }
        pfVar40 = (float *)((long)pvVar13 + uVar25 * lVar39 * 4);
        pfVar26 = pfVar29;
        if ((int)uVar37 < 4) {
          fVar47 = 0.0;
          fVar48 = 0.0;
          fVar49 = 0.0;
          fVar155 = 0.0;
          uVar34 = 0;
        }
        else {
          fVar47 = 0.0;
          fVar48 = 0.0;
          fVar49 = 0.0;
          fVar155 = 0.0;
          iVar21 = 3;
          do {
            fVar47 = fVar47 + *pfVar40 * *pfVar26;
            fVar48 = fVar48 + pfVar40[1] * pfVar26[1];
            fVar49 = fVar49 + pfVar40[2] * pfVar26[2];
            fVar155 = fVar155 + pfVar40[3] * pfVar26[3];
            pfVar26 = pfVar26 + 4;
            pfVar40 = pfVar40 + 4;
            iVar21 = iVar21 + 4;
            uVar34 = local_148;
          } while (iVar21 < (int)uVar37);
        }
        if (uVar37 - uVar34 != 0 && (int)uVar34 <= (int)uVar37) {
          lVar28 = 0;
          do {
            auVar124._0_4_ = auVar124._0_4_ + pfVar40[lVar28] * pfVar26[lVar28];
            lVar28 = lVar28 + 1;
          } while (uVar37 - uVar34 != (int)lVar28);
        }
        auVar124._0_4_ = fVar155 + fVar48 + fVar49 + fVar47 + auVar124._0_4_;
        fVar47 = auVar124._0_4_;
        switch(uVar9) {
        case 1:
          if (auVar124._0_4_ <= 0.0) {
            fVar47 = 0.0;
          }
          break;
        case 2:
          fVar47 = (float)(~-(uint)(0.0 < auVar124._0_4_) & (uint)*pfVar38 |
                          -(uint)(0.0 < auVar124._0_4_) & 0x3f800000) * auVar124._0_4_;
          break;
        case 3:
          if (auVar124._0_4_ <= *pfVar38) {
            auVar124._0_4_ = *pfVar38;
          }
          fVar47 = pfVar38[1];
          if (auVar124._0_4_ <= pfVar38[1]) {
            fVar47 = auVar124._0_4_;
          }
          break;
        case 4:
          if (88.37626 <= auVar124._0_4_) {
            auVar124._0_4_ = 88.37626;
          }
          auVar124._0_4_ =
               expf((float)(-(uint)(auVar124._0_4_ < -88.37626) & 0x42b0c0a5 |
                           ~-(uint)(auVar124._0_4_ < -88.37626) & (uint)-auVar124._0_4_));
          fVar47 = 1.0 / (auVar124._0_4_ + 1.0);
          break;
        case 5:
          fVar47 = expf(auVar124._0_4_);
          fVar47 = logf(fVar47 + 1.0);
          fVar47 = tanhf(fVar47);
          fVar47 = fVar47 * auVar124._0_4_;
          break;
        case 6:
          fVar48 = *pfVar38;
          fVar49 = -pfVar38[1] / fVar48;
          fVar47 = 0.0;
          if ((fVar49 <= auVar124._0_4_) &&
             (fVar47 = auVar124._0_4_, auVar124._0_4_ <= fVar49 + 1.0 / fVar48)) {
            fVar47 = (fVar48 * auVar124._0_4_ + pfVar38[1]) * auVar124._0_4_;
          }
        }
        *(float *)((long)pvVar14 + uVar25 * 4) = fVar47;
        uVar25 = uVar25 + 1;
      } while ((long)uVar25 < (long)(int)uVar10);
    }
    else {
      iVar21 = 0;
      if ((top_blob->elempack != 4) || (iVar21 = 0, (int)uVar10 < 1)) goto LAB_0029a572;
      uVar25 = 0;
      do {
        fVar155 = 0.0;
        fVar159 = 0.0;
        fVar160 = 0.0;
        fVar161 = 0.0;
        if (lVar12 != 0) {
          pfVar29 = (float *)(lVar12 + uVar25 * 0x10);
          fVar155 = *pfVar29;
          fVar159 = pfVar29[1];
          fVar160 = pfVar29[2];
          fVar161 = pfVar29[3];
        }
        pfVar38 = (float *)((long)(this->weight_data_tm).w * uVar25 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar29 = local_e0;
        if ((int)uVar37 < 4) {
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          fVar140 = 0.0;
          fVar152 = 0.0;
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar166 = 0.0;
          fVar168 = 0.0;
          fVar170 = 0.0;
          fVar172 = 0.0;
          uVar34 = 0;
        }
        else {
          fVar166 = 0.0;
          fVar168 = 0.0;
          fVar170 = 0.0;
          fVar172 = 0.0;
          iVar21 = 3;
          fVar140 = 0.0;
          fVar152 = 0.0;
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar162 = 0.0;
          fVar163 = 0.0;
          fVar164 = 0.0;
          fVar165 = 0.0;
          do {
            fVar167 = *pfVar29;
            fVar169 = pfVar29[1];
            fVar171 = pfVar29[2];
            fVar173 = pfVar29[3];
            fVar155 = fVar155 + *pfVar38 * fVar167;
            fVar159 = fVar159 + pfVar38[1] * fVar167;
            fVar160 = fVar160 + pfVar38[2] * fVar167;
            fVar161 = fVar161 + pfVar38[3] * fVar167;
            fVar166 = fVar166 + pfVar38[4] * fVar169;
            fVar168 = fVar168 + pfVar38[5] * fVar169;
            fVar170 = fVar170 + pfVar38[6] * fVar169;
            fVar172 = fVar172 + pfVar38[7] * fVar169;
            fVar140 = fVar140 + pfVar38[8] * fVar171;
            fVar152 = fVar152 + pfVar38[9] * fVar171;
            fVar153 = fVar153 + pfVar38[10] * fVar171;
            fVar154 = fVar154 + pfVar38[0xb] * fVar171;
            fVar162 = fVar162 + pfVar38[0xc] * fVar173;
            fVar163 = fVar163 + pfVar38[0xd] * fVar173;
            fVar164 = fVar164 + pfVar38[0xe] * fVar173;
            fVar165 = fVar165 + pfVar38[0xf] * fVar173;
            pfVar29 = pfVar29 + 4;
            pfVar38 = pfVar38 + 0x10;
            iVar21 = iVar21 + 4;
            uVar34 = uVar37 & 0xfffffffc;
          } while (iVar21 < (int)uVar37);
        }
        if (uVar37 - uVar34 != 0 && (int)uVar34 <= (int)uVar37) {
          lVar39 = 0;
          do {
            fVar167 = pfVar29[lVar39];
            fVar155 = fVar155 + *pfVar38 * fVar167;
            fVar159 = fVar159 + pfVar38[1] * fVar167;
            fVar160 = fVar160 + pfVar38[2] * fVar167;
            fVar161 = fVar161 + pfVar38[3] * fVar167;
            pfVar38 = pfVar38 + 4;
            lVar39 = lVar39 + 1;
          } while (uVar37 - uVar34 != (int)lVar39);
        }
        fVar155 = fVar140 + fVar162 + fVar166 + fVar155;
        fVar159 = fVar152 + fVar163 + fVar168 + fVar159;
        auVar148._0_8_ = CONCAT44(fVar159,fVar155);
        auVar148._8_4_ = fVar153 + fVar164 + fVar170 + fVar160;
        auVar148._12_4_ = fVar154 + fVar165 + fVar172 + fVar161;
        switch(uVar9) {
        case 1:
          auVar148 = maxps(auVar148,ZEXT816(0));
          break;
        case 2:
          auVar86._8_4_ = auVar148._8_4_;
          auVar86._0_8_ = auVar148._0_8_;
          auVar86._12_4_ = auVar148._12_4_;
          auVar146 = maxps(auVar86,ZEXT816(0));
          auVar147 = minps(auVar148,ZEXT816(0));
          fVar155 = **(float **)(&this->field_0xe8 + (long)p_Var11);
          auVar148._4_4_ = fVar155 * auVar147._4_4_ + auVar146._4_4_;
          auVar148._0_4_ = fVar155 * auVar147._0_4_ + auVar146._0_4_;
          auVar148._8_4_ = fVar155 * auVar147._8_4_ + auVar146._8_4_;
          auVar148._12_4_ = fVar155 * auVar147._12_4_ + auVar146._12_4_;
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var11);
          uVar6 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var11))[1];
          auVar84._4_4_ = uVar7;
          auVar84._0_4_ = uVar7;
          auVar84._8_4_ = uVar7;
          auVar84._12_4_ = uVar7;
          auVar102._4_4_ = uVar6;
          auVar102._0_4_ = uVar6;
          auVar102._8_4_ = uVar6;
          auVar102._12_4_ = uVar6;
          auVar146 = maxps(auVar148,auVar84);
          auVar148 = minps(auVar146,auVar102);
          break;
        case 4:
          auVar149._0_8_ = CONCAT44(fVar159,fVar155) ^ 0x8000000080000000;
          auVar149._8_4_ = -auVar148._8_4_;
          auVar149._12_4_ = -auVar148._12_4_;
          auVar146 = minps(auVar149,_DAT_005562e0);
          auVar146 = maxps(auVar146,_DAT_005562f0);
          fVar159 = auVar146._0_4_ * 1.442695 + 0.5;
          fVar161 = auVar146._4_4_ * 1.442695 + 0.5;
          fVar152 = auVar146._8_4_ * 1.442695 + 0.5;
          fVar154 = auVar146._12_4_ * 1.442695 + 0.5;
          fVar155 = (float)(int)fVar159;
          fVar160 = (float)(int)fVar161;
          fVar140 = (float)(int)fVar152;
          fVar153 = (float)(int)fVar154;
          fVar155 = fVar155 - (float)(-(uint)(fVar159 < fVar155) & (uint)auVar124._0_4_);
          fVar160 = fVar160 - (float)(-(uint)(fVar161 < fVar160) & (uint)fVar47);
          fVar140 = fVar140 - (float)(-(uint)(fVar152 < fVar140) & (uint)fVar48);
          fVar153 = fVar153 - (float)(-(uint)(fVar154 < fVar153) & (uint)fVar49);
          fVar159 = fVar155 * -0.6931472 + auVar146._0_4_;
          fVar161 = fVar160 * -0.6931472 + auVar146._4_4_;
          fVar152 = fVar140 * -0.6931472 + auVar146._8_4_;
          fVar154 = fVar153 * -0.6931472 + auVar146._12_4_;
          auVar85._0_4_ =
               fVar159 + auVar124._0_4_ +
               (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                 0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5) * fVar159 * fVar159;
          auVar85._4_4_ =
               fVar161 + fVar47 +
               (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                 0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5) * fVar161 * fVar161;
          auVar85._8_4_ =
               fVar152 + fVar48 +
               (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152;
          auVar85._12_4_ =
               fVar154 + fVar49 +
               (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) * fVar154 +
                 0.041665796) * fVar154 + 0.16666666) * fVar154 + 0.5) * fVar154 * fVar154;
          auVar103._0_4_ =
               (float)((int)fVar155 * 0x800000 + (int)auVar124._0_4_) * auVar85._0_4_ +
               auVar124._0_4_;
          auVar103._4_4_ = (float)((int)fVar160 * 0x800000 + (int)fVar47) * auVar85._4_4_ + fVar47;
          auVar103._8_4_ = (float)((int)fVar140 * 0x800000 + (int)fVar48) * auVar85._8_4_ + fVar48;
          auVar103._12_4_ = (float)((int)fVar153 * 0x800000 + (int)fVar49) * auVar85._12_4_ + fVar49
          ;
          auVar146 = rcpps(auVar85,auVar103);
          fVar155 = auVar146._0_4_;
          fVar159 = auVar146._4_4_;
          fVar160 = auVar146._8_4_;
          fVar161 = auVar146._12_4_;
          auVar148._0_4_ = (auVar124._0_4_ - auVar103._0_4_ * fVar155) * fVar155 + fVar155;
          auVar148._4_4_ = (fVar47 - auVar103._4_4_ * fVar159) * fVar159 + fVar159;
          auVar148._8_4_ = (fVar48 - auVar103._8_4_ * fVar160) * fVar160 + fVar160;
          auVar148._12_4_ = (fVar49 - auVar103._12_4_ * fVar161) * fVar161 + fVar161;
          break;
        case 5:
          auVar81._8_4_ = auVar148._8_4_;
          auVar81._0_8_ = auVar148._0_8_;
          auVar81._12_4_ = auVar148._12_4_;
          auVar146 = minps(auVar81,_DAT_005562e0);
          auVar146 = maxps(auVar146,_DAT_005562f0);
          fVar160 = auVar146._0_4_ * 1.442695 + 0.5;
          fVar161 = auVar146._4_4_ * 1.442695 + 0.5;
          fVar140 = auVar146._8_4_ * 1.442695 + 0.5;
          fVar152 = auVar146._12_4_ * 1.442695 + 0.5;
          fVar153 = (float)(int)fVar160;
          fVar154 = (float)(int)fVar161;
          fVar162 = (float)(int)fVar140;
          fVar163 = (float)(int)fVar152;
          fVar153 = fVar153 - (float)(-(uint)(fVar160 < fVar153) & (uint)auVar124._0_4_);
          fVar154 = fVar154 - (float)(-(uint)(fVar161 < fVar154) & (uint)fVar47);
          fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & (uint)fVar48);
          fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & (uint)fVar49);
          fVar160 = auVar146._0_4_ - fVar153 * 0.6931472;
          fVar161 = auVar146._4_4_ - fVar154 * 0.6931472;
          fVar140 = auVar146._8_4_ - fVar162 * 0.6931472;
          fVar152 = auVar146._12_4_ - fVar163 * 0.6931472;
          auVar156._0_4_ =
               (float)((int)fVar153 * 0x800000 + (int)auVar124._0_4_) *
               (fVar160 + auVar124._0_4_ +
               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160) +
               auVar124._0_4_;
          auVar156._4_4_ =
               (float)((int)fVar154 * 0x800000 + (int)fVar47) *
               (fVar161 + fVar47 +
               (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                 0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5) * fVar161 * fVar161) + fVar47
          ;
          auVar156._8_4_ =
               (float)((int)fVar162 * 0x800000 + (int)fVar48) *
               (fVar140 + fVar48 +
               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) + fVar48
          ;
          auVar156._12_4_ =
               (float)((int)fVar163 * 0x800000 + (int)fVar49) *
               (fVar152 + fVar49 +
               (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152) + fVar49
          ;
          auVar146 = maxps(auVar156,_DAT_00556390);
          fVar160 = (float)(auVar146._0_4_ & 0x807fffff | 0x3f000000);
          fVar140 = (float)(auVar146._4_4_ & 0x807fffff | 0x3f000000);
          fVar153 = (float)(auVar146._8_4_ & 0x807fffff | 0x3f000000);
          fVar162 = (float)(auVar146._12_4_ & 0x807fffff | 0x3f000000);
          fVar161 = fVar160 + -1.0 + (float)(-(uint)(fVar160 < 0.70710677) & (uint)fVar160);
          fVar152 = fVar140 + -1.0 + (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
          fVar154 = fVar153 + -1.0 + (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar153);
          fVar163 = fVar162 + -1.0 + (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar162);
          auVar101._0_4_ =
               ~-(uint)(auVar156._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar146._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar160 < 0.70710677) & (uint)auVar124._0_4_)) * 0.6931472 +
                       fVar161 +
                      (((((((((fVar161 * 0.070376836 + -0.1151461) * fVar161 + 0.116769984) *
                             fVar161 + -0.12420141) * fVar161 + 0.14249323) * fVar161 + -0.16668057)
                          * fVar161 + 0.20000714) * fVar161 + -0.24999994) * fVar161 + 0.3333333) *
                       fVar161 + -0.5) * fVar161 * fVar161) * -2.0);
          auVar101._4_4_ =
               ~-(uint)(auVar156._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar146._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar47)) * 0.6931472 + fVar152
                      + (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) *
                               fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                            -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) * fVar152
                         + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
          auVar101._8_4_ =
               ~-(uint)(auVar156._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar146._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar153 < 0.70710677) & (uint)fVar48)) * 0.6931472 + fVar154
                      + (((((((((fVar154 * 0.070376836 + -0.1151461) * fVar154 + 0.116769984) *
                               fVar154 + -0.12420141) * fVar154 + 0.14249323) * fVar154 +
                            -0.16668057) * fVar154 + 0.20000714) * fVar154 + -0.24999994) * fVar154
                         + 0.3333333) * fVar154 + -0.5) * fVar154 * fVar154) * -2.0);
          auVar101._12_4_ =
               ~-(uint)(auVar156._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar146._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar162 < 0.70710677) & (uint)fVar49)) * 0.6931472 + fVar163
                      + (((((((((fVar163 * 0.070376836 + -0.1151461) * fVar163 + 0.116769984) *
                               fVar163 + -0.12420141) * fVar163 + 0.14249323) * fVar163 +
                            -0.16668057) * fVar163 + 0.20000714) * fVar163 + -0.24999994) * fVar163
                         + 0.3333333) * fVar163 + -0.5) * fVar163 * fVar163) * -2.0);
          auVar82._0_8_ =
               CONCAT44(-(uint)(auVar156._4_4_ <= 0.0),-(uint)(auVar156._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar82._8_4_ = -(uint)(auVar156._8_4_ <= 0.0) & 0x7fffffff;
          auVar82._12_4_ = -(uint)(auVar156._12_4_ <= 0.0) & 0x7fffffff;
          auVar146 = minps(auVar82 | auVar101,_DAT_005562e0);
          auVar146 = maxps(auVar146,_DAT_005562f0);
          fVar160 = auVar146._0_4_ * 1.442695 + 0.5;
          fVar161 = auVar146._4_4_ * 1.442695 + 0.5;
          fVar140 = auVar146._8_4_ * 1.442695 + 0.5;
          fVar152 = auVar146._12_4_ * 1.442695 + 0.5;
          fVar153 = (float)(int)fVar160;
          fVar154 = (float)(int)fVar161;
          fVar162 = (float)(int)fVar140;
          fVar163 = (float)(int)fVar152;
          fVar153 = fVar153 - (float)(-(uint)(fVar160 < fVar153) & (uint)auVar124._0_4_);
          fVar154 = fVar154 - (float)(-(uint)(fVar161 < fVar154) & (uint)fVar47);
          fVar162 = fVar162 - (float)(-(uint)(fVar140 < fVar162) & (uint)fVar48);
          fVar163 = fVar163 - (float)(-(uint)(fVar152 < fVar163) & (uint)fVar49);
          fVar160 = auVar146._0_4_ - fVar153 * 0.6931472;
          fVar161 = auVar146._4_4_ - fVar154 * 0.6931472;
          fVar140 = auVar146._8_4_ - fVar162 * 0.6931472;
          fVar152 = auVar146._12_4_ - fVar163 * 0.6931472;
          auVar83._0_4_ =
               fVar160 + auVar124._0_4_ +
               (((((fVar160 * 0.00019875691 + 0.0013981999) * fVar160 + 0.008333452) * fVar160 +
                 0.041665796) * fVar160 + 0.16666666) * fVar160 + 0.5) * fVar160 * fVar160;
          auVar83._4_4_ =
               fVar161 + fVar47 +
               (((((fVar161 * 0.00019875691 + 0.0013981999) * fVar161 + 0.008333452) * fVar161 +
                 0.041665796) * fVar161 + 0.16666666) * fVar161 + 0.5) * fVar161 * fVar161;
          auVar83._8_4_ =
               fVar140 + fVar48 +
               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140;
          auVar83._12_4_ =
               fVar152 + fVar49 +
               (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152;
          fVar153 = (float)((int)fVar153 * 0x800000 + (int)auVar124._0_4_) * auVar83._0_4_ +
                    auVar124._0_4_;
          fVar154 = (float)((int)fVar154 * 0x800000 + (int)fVar47) * auVar83._4_4_ + fVar47;
          fVar162 = (float)((int)fVar162 * 0x800000 + (int)fVar48) * auVar83._8_4_ + fVar48;
          fVar163 = (float)((int)fVar163 * 0x800000 + (int)fVar49) * auVar83._12_4_ + fVar49;
          auVar15._4_4_ = fVar154;
          auVar15._0_4_ = fVar153;
          auVar15._8_4_ = fVar162;
          auVar15._12_4_ = fVar163;
          auVar146 = rcpps(auVar83,auVar15);
          fVar160 = auVar146._0_4_;
          fVar161 = auVar146._4_4_;
          fVar140 = auVar146._8_4_;
          fVar152 = auVar146._12_4_;
          auVar148._0_4_ =
               fVar155 * (fVar160 + fVar160 + -1.0 + (2.0 - fVar153 * (fVar160 + fVar160)) * fVar160
                         );
          auVar148._4_4_ =
               fVar159 * (fVar161 + fVar161 + -1.0 + (2.0 - fVar154 * (fVar161 + fVar161)) * fVar161
                         );
          auVar148._8_4_ =
               auVar148._8_4_ *
               (fVar140 + fVar140 + -1.0 + (2.0 - fVar162 * (fVar140 + fVar140)) * fVar140);
          auVar148._12_4_ =
               auVar148._12_4_ *
               (fVar152 + fVar152 + -1.0 + (2.0 - fVar163 * (fVar152 + fVar152)) * fVar152);
          break;
        case 6:
          fVar160 = **(float **)(&this->field_0xe8 + (long)p_Var11);
          fVar161 = (*(float **)(&this->field_0xe8 + (long)p_Var11))[1];
          auVar87._0_4_ = fVar160 * fVar155 + fVar161;
          auVar87._4_4_ = fVar160 * fVar159 + fVar161;
          auVar87._8_4_ = fVar160 * auVar148._8_4_ + fVar161;
          auVar87._12_4_ = fVar160 * auVar148._12_4_ + fVar161;
          auVar146 = maxps(auVar87,ZEXT816(0));
          auVar146 = minps(auVar146,auVar145);
          auVar148._0_4_ = fVar155 * auVar146._0_4_;
          auVar148._4_4_ = fVar159 * auVar146._4_4_;
          auVar148._8_4_ = auVar148._8_4_ * auVar146._8_4_;
          auVar148._12_4_ = auVar148._12_4_ * auVar146._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar25 * 0x10) = auVar148;
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar10);
    }
    iVar21 = 0;
  }
LAB_0029a572:
  if (local_d8 != (int *)0x0) {
    LOCK();
    *local_d8 = *local_d8 + -1;
    UNLOCK();
    if (*local_d8 == 0) {
      if (local_c0 == (Allocator *)0x0) {
        if (local_e0 != (float *)0x0) {
          free(local_e0);
        }
      }
      else {
        (*local_c0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}